

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

void embree::avx2::CurveNvIntersectorK<8,8>::
     intersect_t<embree::avx2::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx2::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [32];
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Primitive PVar13;
  Geometry *pGVar14;
  RTCFilterFunctionN p_Var15;
  code *pcVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  long lVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  long lVar91;
  undefined1 auVar92 [12];
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  undefined8 uVar98;
  undefined1 auVar99 [28];
  undefined1 auVar100 [28];
  int iVar101;
  uint uVar102;
  ulong uVar103;
  uint uVar104;
  ulong uVar105;
  long lVar106;
  ulong uVar107;
  undefined4 uVar108;
  float fVar124;
  undefined8 uVar109;
  float fVar126;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar125;
  float fVar127;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined8 uVar131;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  float fVar146;
  undefined1 auVar148 [16];
  float fVar147;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar149 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar163 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined8 uVar189;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  float fVar197;
  undefined1 auVar196 [64];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar214 [32];
  undefined4 uVar202;
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  float fVar206;
  float fVar207;
  float fVar208;
  undefined1 in_ZMM10 [64];
  undefined4 uVar209;
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [64];
  undefined1 auVar213 [16];
  undefined1 auVar215 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar216 [64];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [64];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined1 local_880 [32];
  RTCFilterFunctionNArguments local_810;
  undefined1 local_7e0 [32];
  undefined1 (*local_7a8) [32];
  undefined1 local_7a0 [32];
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [2] [32];
  uint local_640;
  uint uStack_63c;
  uint uStack_638;
  uint uStack_634;
  uint uStack_630;
  uint uStack_62c;
  uint uStack_628;
  uint uStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  int iStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  int local_3c0;
  int local_3bc;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  float local_340 [4];
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined4 local_280;
  undefined4 uStack_27c;
  undefined4 uStack_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined4 local_200;
  undefined4 uStack_1fc;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  uint local_180;
  uint uStack_17c;
  uint uStack_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined1 local_120 [32];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  
  PVar13 = prim[1];
  uVar107 = (ulong)(byte)PVar13;
  lVar91 = uVar107 * 0x19;
  fVar147 = *(float *)(prim + lVar91 + 0x12);
  auVar171 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar171 = vinsertps_avx(auVar171,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar17 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar171 = vsubps_avx(auVar171,*(undefined1 (*) [16])(prim + lVar91 + 6));
  auVar110._0_4_ = fVar147 * auVar171._0_4_;
  auVar110._4_4_ = fVar147 * auVar171._4_4_;
  auVar110._8_4_ = fVar147 * auVar171._8_4_;
  auVar110._12_4_ = fVar147 * auVar171._12_4_;
  auVar190._0_4_ = fVar147 * auVar17._0_4_;
  auVar190._4_4_ = fVar147 * auVar17._4_4_;
  auVar190._8_4_ = fVar147 * auVar17._8_4_;
  auVar190._12_4_ = fVar147 * auVar17._12_4_;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = *(ulong *)(prim + uVar107 * 4 + 6);
  auVar120 = vpmovsxbd_avx2(auVar171);
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar107 * 5 + 6);
  auVar187 = vpmovsxbd_avx2(auVar17);
  auVar187 = vcvtdq2ps_avx(auVar187);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar107 * 6 + 6);
  auVar118 = vpmovsxbd_avx2(auVar7);
  auVar118 = vcvtdq2ps_avx(auVar118);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar107 * 0xb + 6);
  auVar137 = vpmovsxbd_avx2(auVar8);
  auVar137 = vcvtdq2ps_avx(auVar137);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar13 * 0xc) + 6);
  auVar214 = vpmovsxbd_avx2(auVar9);
  auVar214 = vcvtdq2ps_avx(auVar214);
  auVar176._8_8_ = 0;
  auVar176._0_8_ = *(ulong *)(prim + (uint)(byte)PVar13 * 0xc + uVar107 + 6);
  auVar19 = vpmovsxbd_avx2(auVar176);
  auVar19 = vcvtdq2ps_avx(auVar19);
  uVar103 = (ulong)(uint)((int)(uVar107 * 9) * 2);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar103 + 6);
  auVar198 = vpmovsxbd_avx2(auVar10);
  auVar198 = vcvtdq2ps_avx(auVar198);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar103 + uVar107 + 6);
  auVar20 = vpmovsxbd_avx2(auVar11);
  auVar20 = vcvtdq2ps_avx(auVar20);
  uVar103 = (ulong)(uint)((int)(uVar107 * 5) << 2);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar103 + 6);
  auVar162 = vpmovsxbd_avx2(auVar12);
  auVar162 = vcvtdq2ps_avx(auVar162);
  auVar220._4_4_ = auVar190._0_4_;
  auVar220._0_4_ = auVar190._0_4_;
  auVar220._8_4_ = auVar190._0_4_;
  auVar220._12_4_ = auVar190._0_4_;
  auVar220._16_4_ = auVar190._0_4_;
  auVar220._20_4_ = auVar190._0_4_;
  auVar220._24_4_ = auVar190._0_4_;
  auVar220._28_4_ = auVar190._0_4_;
  auVar171 = vmovshdup_avx(auVar190);
  uVar189 = auVar171._0_8_;
  auVar225._8_8_ = uVar189;
  auVar225._0_8_ = uVar189;
  auVar225._16_8_ = uVar189;
  auVar225._24_8_ = uVar189;
  auVar171 = vshufps_avx(auVar190,auVar190,0xaa);
  fVar147 = auVar171._0_4_;
  auVar212._0_4_ = fVar147 * auVar118._0_4_;
  fVar124 = auVar171._4_4_;
  auVar212._4_4_ = fVar124 * auVar118._4_4_;
  auVar212._8_4_ = fVar147 * auVar118._8_4_;
  auVar212._12_4_ = fVar124 * auVar118._12_4_;
  auVar212._16_4_ = fVar147 * auVar118._16_4_;
  auVar212._20_4_ = fVar124 * auVar118._20_4_;
  auVar212._28_36_ = in_ZMM12._28_36_;
  auVar212._24_4_ = fVar147 * auVar118._24_4_;
  auVar216._0_4_ = auVar19._0_4_ * fVar147;
  auVar216._4_4_ = auVar19._4_4_ * fVar124;
  auVar216._8_4_ = auVar19._8_4_ * fVar147;
  auVar216._12_4_ = auVar19._12_4_ * fVar124;
  auVar216._16_4_ = auVar19._16_4_ * fVar147;
  auVar216._20_4_ = auVar19._20_4_ * fVar124;
  auVar216._28_36_ = in_ZMM10._28_36_;
  auVar216._24_4_ = auVar19._24_4_ * fVar147;
  auVar199._0_4_ = auVar162._0_4_ * fVar147;
  auVar199._4_4_ = auVar162._4_4_ * fVar124;
  auVar199._8_4_ = auVar162._8_4_ * fVar147;
  auVar199._12_4_ = auVar162._12_4_ * fVar124;
  auVar199._16_4_ = auVar162._16_4_ * fVar147;
  auVar199._20_4_ = auVar162._20_4_ * fVar124;
  auVar199._24_4_ = auVar162._24_4_ * fVar147;
  auVar199._28_4_ = 0;
  auVar171 = vfmadd231ps_fma(auVar212._0_32_,auVar225,auVar187);
  auVar17 = vfmadd231ps_fma(auVar216._0_32_,auVar225,auVar214);
  auVar7 = vfmadd231ps_fma(auVar199,auVar20,auVar225);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar171),auVar220,auVar120);
  auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar220,auVar137);
  auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar198,auVar220);
  auVar221._4_4_ = auVar110._0_4_;
  auVar221._0_4_ = auVar110._0_4_;
  auVar221._8_4_ = auVar110._0_4_;
  auVar221._12_4_ = auVar110._0_4_;
  auVar221._16_4_ = auVar110._0_4_;
  auVar221._20_4_ = auVar110._0_4_;
  auVar221._24_4_ = auVar110._0_4_;
  auVar221._28_4_ = auVar110._0_4_;
  auVar171 = vmovshdup_avx(auVar110);
  uVar189 = auVar171._0_8_;
  auVar226._8_8_ = uVar189;
  auVar226._0_8_ = uVar189;
  auVar226._16_8_ = uVar189;
  auVar226._24_8_ = uVar189;
  auVar171 = vshufps_avx(auVar110,auVar110,0xaa);
  fVar147 = auVar171._0_4_;
  auVar193._0_4_ = fVar147 * auVar118._0_4_;
  fVar124 = auVar171._4_4_;
  auVar193._4_4_ = fVar124 * auVar118._4_4_;
  auVar193._8_4_ = fVar147 * auVar118._8_4_;
  auVar193._12_4_ = fVar124 * auVar118._12_4_;
  auVar193._16_4_ = fVar147 * auVar118._16_4_;
  auVar193._20_4_ = fVar124 * auVar118._20_4_;
  auVar193._24_4_ = fVar147 * auVar118._24_4_;
  auVar193._28_4_ = 0;
  auVar18._4_4_ = auVar19._4_4_ * fVar124;
  auVar18._0_4_ = auVar19._0_4_ * fVar147;
  auVar18._8_4_ = auVar19._8_4_ * fVar147;
  auVar18._12_4_ = auVar19._12_4_ * fVar124;
  auVar18._16_4_ = auVar19._16_4_ * fVar147;
  auVar18._20_4_ = auVar19._20_4_ * fVar124;
  auVar18._24_4_ = auVar19._24_4_ * fVar147;
  auVar18._28_4_ = auVar118._28_4_;
  auVar118._4_4_ = auVar162._4_4_ * fVar124;
  auVar118._0_4_ = auVar162._0_4_ * fVar147;
  auVar118._8_4_ = auVar162._8_4_ * fVar147;
  auVar118._12_4_ = auVar162._12_4_ * fVar124;
  auVar118._16_4_ = auVar162._16_4_ * fVar147;
  auVar118._20_4_ = auVar162._20_4_ * fVar124;
  auVar118._24_4_ = auVar162._24_4_ * fVar147;
  auVar118._28_4_ = fVar124;
  auVar171 = vfmadd231ps_fma(auVar193,auVar226,auVar187);
  auVar9 = vfmadd231ps_fma(auVar18,auVar226,auVar214);
  auVar176 = vfmadd231ps_fma(auVar118,auVar226,auVar20);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar171),auVar221,auVar120);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar221,auVar137);
  local_2c0._8_4_ = 0x7fffffff;
  local_2c0._0_8_ = 0x7fffffff7fffffff;
  local_2c0._12_4_ = 0x7fffffff;
  local_2c0._16_4_ = 0x7fffffff;
  local_2c0._20_4_ = 0x7fffffff;
  local_2c0._24_4_ = 0x7fffffff;
  local_2c0._28_4_ = 0x7fffffff;
  auVar158._8_4_ = 0x219392ef;
  auVar158._0_8_ = 0x219392ef219392ef;
  auVar158._12_4_ = 0x219392ef;
  auVar158._16_4_ = 0x219392ef;
  auVar158._20_4_ = 0x219392ef;
  auVar158._24_4_ = 0x219392ef;
  auVar158._28_4_ = 0x219392ef;
  auVar120 = vandps_avx(ZEXT1632(auVar8),local_2c0);
  auVar120 = vcmpps_avx(auVar120,auVar158,1);
  auVar187 = vblendvps_avx(ZEXT1632(auVar8),auVar158,auVar120);
  auVar120 = vandps_avx(ZEXT1632(auVar17),local_2c0);
  auVar120 = vcmpps_avx(auVar120,auVar158,1);
  auVar118 = vblendvps_avx(ZEXT1632(auVar17),auVar158,auVar120);
  auVar120 = vandps_avx(ZEXT1632(auVar7),local_2c0);
  auVar120 = vcmpps_avx(auVar120,auVar158,1);
  auVar120 = vblendvps_avx(ZEXT1632(auVar7),auVar158,auVar120);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar176),auVar221,auVar198);
  auVar137 = vrcpps_avx(auVar187);
  auVar121._8_4_ = 0x3f800000;
  auVar121._0_8_ = 0x3f8000003f800000;
  auVar121._12_4_ = 0x3f800000;
  auVar121._16_4_ = 0x3f800000;
  auVar121._20_4_ = 0x3f800000;
  auVar121._24_4_ = 0x3f800000;
  auVar121._28_4_ = 0x3f800000;
  auVar171 = vfnmadd213ps_fma(auVar187,auVar137,auVar121);
  auVar171 = vfmadd132ps_fma(ZEXT1632(auVar171),auVar137,auVar137);
  auVar187 = vrcpps_avx(auVar118);
  auVar17 = vfnmadd213ps_fma(auVar118,auVar187,auVar121);
  auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar187,auVar187);
  auVar187 = vrcpps_avx(auVar120);
  auVar7 = vfnmadd213ps_fma(auVar120,auVar187,auVar121);
  auVar7 = vfmadd132ps_fma(ZEXT1632(auVar7),auVar187,auVar187);
  auVar120 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar107 * 7 + 6));
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar120 = vsubps_avx(auVar120,ZEXT1632(auVar10));
  auVar137._4_4_ = auVar171._4_4_ * auVar120._4_4_;
  auVar137._0_4_ = auVar171._0_4_ * auVar120._0_4_;
  auVar137._8_4_ = auVar171._8_4_ * auVar120._8_4_;
  auVar137._12_4_ = auVar171._12_4_ * auVar120._12_4_;
  auVar137._16_4_ = auVar120._16_4_ * 0.0;
  auVar137._20_4_ = auVar120._20_4_ * 0.0;
  auVar137._24_4_ = auVar120._24_4_ * 0.0;
  auVar137._28_4_ = auVar120._28_4_;
  auVar120 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar107 * 9 + 6));
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar120 = vsubps_avx(auVar120,ZEXT1632(auVar10));
  auVar214._4_4_ = auVar171._4_4_ * auVar120._4_4_;
  auVar214._0_4_ = auVar171._0_4_ * auVar120._0_4_;
  auVar214._8_4_ = auVar171._8_4_ * auVar120._8_4_;
  auVar214._12_4_ = auVar171._12_4_ * auVar120._12_4_;
  auVar214._16_4_ = auVar120._16_4_ * 0.0;
  auVar214._20_4_ = auVar120._20_4_ * 0.0;
  auVar214._24_4_ = auVar120._24_4_ * 0.0;
  auVar214._28_4_ = auVar120._28_4_;
  auVar132._1_3_ = 0;
  auVar132[0] = PVar13;
  auVar187 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar13 * 0x10 + 6));
  auVar120 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar13 * 0x10 + uVar107 * -2 + 6));
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar120 = vsubps_avx(auVar120,ZEXT1632(auVar9));
  auVar19._4_4_ = auVar120._4_4_ * auVar17._4_4_;
  auVar19._0_4_ = auVar120._0_4_ * auVar17._0_4_;
  auVar19._8_4_ = auVar120._8_4_ * auVar17._8_4_;
  auVar19._12_4_ = auVar120._12_4_ * auVar17._12_4_;
  auVar19._16_4_ = auVar120._16_4_ * 0.0;
  auVar19._20_4_ = auVar120._20_4_ * 0.0;
  auVar19._24_4_ = auVar120._24_4_ * 0.0;
  auVar19._28_4_ = auVar120._28_4_;
  auVar120 = vcvtdq2ps_avx(auVar187);
  auVar120 = vsubps_avx(auVar120,ZEXT1632(auVar9));
  auVar198._4_4_ = auVar17._4_4_ * auVar120._4_4_;
  auVar198._0_4_ = auVar17._0_4_ * auVar120._0_4_;
  auVar198._8_4_ = auVar17._8_4_ * auVar120._8_4_;
  auVar198._12_4_ = auVar17._12_4_ * auVar120._12_4_;
  auVar198._16_4_ = auVar120._16_4_ * 0.0;
  auVar198._20_4_ = auVar120._20_4_ * 0.0;
  auVar198._24_4_ = auVar120._24_4_ * 0.0;
  auVar198._28_4_ = auVar120._28_4_;
  auVar120 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar103 + uVar107 + 6));
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar120 = vsubps_avx(auVar120,ZEXT1632(auVar8));
  auVar20._4_4_ = auVar120._4_4_ * auVar7._4_4_;
  auVar20._0_4_ = auVar120._0_4_ * auVar7._0_4_;
  auVar20._8_4_ = auVar120._8_4_ * auVar7._8_4_;
  auVar20._12_4_ = auVar120._12_4_ * auVar7._12_4_;
  auVar20._16_4_ = auVar120._16_4_ * 0.0;
  auVar20._20_4_ = auVar120._20_4_ * 0.0;
  auVar20._24_4_ = auVar120._24_4_ * 0.0;
  auVar20._28_4_ = auVar120._28_4_;
  auVar120 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar107 * 0x17 + 6));
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar120 = vsubps_avx(auVar120,ZEXT1632(auVar8));
  auVar162._4_4_ = auVar7._4_4_ * auVar120._4_4_;
  auVar162._0_4_ = auVar7._0_4_ * auVar120._0_4_;
  auVar162._8_4_ = auVar7._8_4_ * auVar120._8_4_;
  auVar162._12_4_ = auVar7._12_4_ * auVar120._12_4_;
  auVar162._16_4_ = auVar120._16_4_ * 0.0;
  auVar162._20_4_ = auVar120._20_4_ * 0.0;
  auVar162._24_4_ = auVar120._24_4_ * 0.0;
  auVar162._28_4_ = auVar120._28_4_;
  auVar120 = vpminsd_avx2(auVar137,auVar214);
  auVar187 = vpminsd_avx2(auVar19,auVar198);
  auVar120 = vmaxps_avx(auVar120,auVar187);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar194._4_4_ = uVar4;
  auVar194._0_4_ = uVar4;
  auVar194._8_4_ = uVar4;
  auVar194._12_4_ = uVar4;
  auVar194._16_4_ = uVar4;
  auVar194._20_4_ = uVar4;
  auVar194._24_4_ = uVar4;
  auVar194._28_4_ = uVar4;
  auVar187 = vpminsd_avx2(auVar20,auVar162);
  auVar187 = vmaxps_avx(auVar187,auVar194);
  auVar120 = vmaxps_avx(auVar120,auVar187);
  local_80._4_4_ = auVar120._4_4_ * 0.99999964;
  local_80._0_4_ = auVar120._0_4_ * 0.99999964;
  local_80._8_4_ = auVar120._8_4_ * 0.99999964;
  local_80._12_4_ = auVar120._12_4_ * 0.99999964;
  local_80._16_4_ = auVar120._16_4_ * 0.99999964;
  local_80._20_4_ = auVar120._20_4_ * 0.99999964;
  local_80._24_4_ = auVar120._24_4_ * 0.99999964;
  local_80._28_4_ = auVar187._28_4_;
  auVar120 = vpmaxsd_avx2(auVar137,auVar214);
  auVar187 = vpmaxsd_avx2(auVar19,auVar198);
  auVar120 = vminps_avx(auVar120,auVar187);
  auVar187 = vpmaxsd_avx2(auVar20,auVar162);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar159._4_4_ = uVar4;
  auVar159._0_4_ = uVar4;
  auVar159._8_4_ = uVar4;
  auVar159._12_4_ = uVar4;
  auVar159._16_4_ = uVar4;
  auVar159._20_4_ = uVar4;
  auVar159._24_4_ = uVar4;
  auVar159._28_4_ = uVar4;
  auVar187 = vminps_avx(auVar187,auVar159);
  auVar120 = vminps_avx(auVar120,auVar187);
  auVar227._4_4_ = auVar120._4_4_ * 1.0000004;
  auVar227._0_4_ = auVar120._0_4_ * 1.0000004;
  auVar227._8_4_ = auVar120._8_4_ * 1.0000004;
  auVar227._12_4_ = auVar120._12_4_ * 1.0000004;
  auVar227._16_4_ = auVar120._16_4_ * 1.0000004;
  auVar227._20_4_ = auVar120._20_4_ * 1.0000004;
  auVar227._24_4_ = auVar120._24_4_ * 1.0000004;
  auVar227._28_4_ = auVar120._28_4_;
  auVar132[4] = PVar13;
  auVar132._5_3_ = 0;
  auVar132[8] = PVar13;
  auVar132._9_3_ = 0;
  auVar132[0xc] = PVar13;
  auVar132._13_3_ = 0;
  auVar132[0x10] = PVar13;
  auVar132._17_3_ = 0;
  auVar132[0x14] = PVar13;
  auVar132._21_3_ = 0;
  auVar132[0x18] = PVar13;
  auVar132._25_3_ = 0;
  auVar132[0x1c] = PVar13;
  auVar132._29_3_ = 0;
  auVar187 = vpcmpgtd_avx2(auVar132,_DAT_01fe9900);
  auVar120 = vcmpps_avx(local_80,auVar227,2);
  auVar120 = vandps_avx(auVar120,auVar187);
  uVar104 = vmovmskps_avx(auVar120);
  if (uVar104 != 0) {
    uVar104 = uVar104 & 0xff;
    local_680[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_680[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_680[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_680[1]._24_8_ = mm_lookupmask_ps._24_8_;
    local_7a8 = (undefined1 (*) [32])&local_1a0;
    iVar101 = 1 << ((uint)k & 0x1f);
    auVar120._4_4_ = iVar101;
    auVar120._0_4_ = iVar101;
    auVar120._8_4_ = iVar101;
    auVar120._12_4_ = iVar101;
    auVar120._16_4_ = iVar101;
    auVar120._20_4_ = iVar101;
    auVar120._24_4_ = iVar101;
    auVar120._28_4_ = iVar101;
    auVar187 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
    auVar120 = vpand_avx2(auVar120,auVar187);
    local_2e0 = vpcmpeqd_avx2(auVar120,auVar187);
    local_430 = 0x7fffffff;
    uStack_42c = 0x7fffffff;
    uStack_428 = 0x7fffffff;
    uStack_424 = 0x7fffffff;
    do {
      auVar120 = local_5c0;
      lVar21 = 0;
      uVar107 = (ulong)uVar104;
      for (uVar103 = uVar107; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x8000000000000000) {
        lVar21 = lVar21 + 1;
      }
      uVar107 = uVar107 - 1 & uVar107;
      uVar4 = *(undefined4 *)(prim + lVar21 * 4 + 6);
      uVar103 = (ulong)(uint)((int)lVar21 << 6);
      local_880._4_4_ = *(undefined4 *)(prim + 2);
      pGVar14 = (context->scene->geometries).items[(uint)local_880._4_4_].ptr;
      pPVar1 = prim + uVar103 + lVar91 + 0x16;
      uVar189 = *(undefined8 *)pPVar1;
      uVar98 = *(undefined8 *)(pPVar1 + 8);
      auVar7 = *(undefined1 (*) [16])pPVar1;
      auVar17 = *(undefined1 (*) [16])pPVar1;
      auVar171 = *(undefined1 (*) [16])pPVar1;
      if (uVar107 != 0) {
        uVar105 = uVar107 - 1 & uVar107;
        for (uVar22 = uVar107; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
        }
        if (uVar105 != 0) {
          for (; (uVar105 & 1) == 0; uVar105 = uVar105 >> 1 | 0x8000000000000000) {
          }
        }
      }
      auVar8 = *(undefined1 (*) [16])(prim + uVar103 + lVar91 + 0x26);
      auVar9 = *(undefined1 (*) [16])(prim + uVar103 + lVar91 + 0x36);
      auVar176 = *(undefined1 (*) [16])(prim + uVar103 + lVar91 + 0x46);
      iVar101 = (int)pGVar14[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20))
                              ,0x1c);
      auVar110 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar11 = vsubps_avx(*(undefined1 (*) [16])pPVar1,auVar110);
      uVar108 = auVar11._0_4_;
      auVar168._4_4_ = uVar108;
      auVar168._0_4_ = uVar108;
      auVar168._8_4_ = uVar108;
      auVar168._12_4_ = uVar108;
      auVar10 = vshufps_avx(auVar11,auVar11,0x55);
      auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
      aVar5 = pre->ray_space[k].vx.field_0;
      aVar6 = pre->ray_space[k].vy.field_0;
      fVar147 = pre->ray_space[k].vz.field_0.m128[0];
      fVar124 = pre->ray_space[k].vz.field_0.m128[1];
      fVar93 = pre->ray_space[k].vz.field_0.m128[2];
      fVar94 = pre->ray_space[k].vz.field_0.m128[3];
      auVar185._0_4_ = fVar147 * auVar11._0_4_;
      auVar185._4_4_ = fVar124 * auVar11._4_4_;
      auVar185._8_4_ = fVar93 * auVar11._8_4_;
      auVar185._12_4_ = fVar94 * auVar11._12_4_;
      auVar10 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar6,auVar10);
      auVar168 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar5,auVar168);
      auVar10 = vblendps_avx(auVar168,*(undefined1 (*) [16])pPVar1,8);
      auVar12 = vsubps_avx(auVar8,auVar110);
      uVar108 = auVar12._0_4_;
      auVar186._4_4_ = uVar108;
      auVar186._0_4_ = uVar108;
      auVar186._8_4_ = uVar108;
      auVar186._12_4_ = uVar108;
      auVar11 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar203._0_4_ = fVar147 * auVar12._0_4_;
      auVar203._4_4_ = fVar124 * auVar12._4_4_;
      auVar203._8_4_ = fVar93 * auVar12._8_4_;
      auVar203._12_4_ = fVar94 * auVar12._12_4_;
      auVar11 = vfmadd231ps_fma(auVar203,(undefined1  [16])aVar6,auVar11);
      auVar185 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar5,auVar186);
      auVar11 = vblendps_avx(auVar185,auVar8,8);
      auVar190 = vsubps_avx(auVar9,auVar110);
      uVar108 = auVar190._0_4_;
      auVar191._4_4_ = uVar108;
      auVar191._0_4_ = uVar108;
      auVar191._8_4_ = uVar108;
      auVar191._12_4_ = uVar108;
      auVar12 = vshufps_avx(auVar190,auVar190,0x55);
      auVar190 = vshufps_avx(auVar190,auVar190,0xaa);
      auVar210._0_4_ = fVar147 * auVar190._0_4_;
      auVar210._4_4_ = fVar124 * auVar190._4_4_;
      auVar210._8_4_ = fVar93 * auVar190._8_4_;
      auVar210._12_4_ = fVar94 * auVar190._12_4_;
      auVar12 = vfmadd231ps_fma(auVar210,(undefined1  [16])aVar6,auVar12);
      auVar186 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar5,auVar191);
      auVar12 = vblendps_avx(auVar186,auVar9,8);
      auVar190 = vsubps_avx(auVar176,auVar110);
      uVar108 = auVar190._0_4_;
      auVar192._4_4_ = uVar108;
      auVar192._0_4_ = uVar108;
      auVar192._8_4_ = uVar108;
      auVar192._12_4_ = uVar108;
      auVar110 = vshufps_avx(auVar190,auVar190,0x55);
      auVar190 = vshufps_avx(auVar190,auVar190,0xaa);
      auVar213._0_4_ = fVar147 * auVar190._0_4_;
      auVar213._4_4_ = fVar124 * auVar190._4_4_;
      auVar213._8_4_ = fVar93 * auVar190._8_4_;
      auVar213._12_4_ = fVar94 * auVar190._12_4_;
      auVar110 = vfmadd231ps_fma(auVar213,(undefined1  [16])aVar6,auVar110);
      auVar191 = vfmadd231ps_fma(auVar110,(undefined1  [16])aVar5,auVar192);
      auVar110 = vblendps_avx(auVar191,auVar176,8);
      auVar23._4_4_ = uStack_42c;
      auVar23._0_4_ = local_430;
      auVar23._8_4_ = uStack_428;
      auVar23._12_4_ = uStack_424;
      auVar10 = vandps_avx(auVar10,auVar23);
      auVar11 = vandps_avx(auVar11,auVar23);
      auVar190 = vmaxps_avx(auVar10,auVar11);
      auVar10 = vandps_avx(auVar12,auVar23);
      auVar11 = vandps_avx(auVar110,auVar23);
      auVar10 = vmaxps_avx(auVar10,auVar11);
      auVar10 = vmaxps_avx(auVar190,auVar10);
      auVar11 = vmovshdup_avx(auVar10);
      auVar11 = vmaxss_avx(auVar11,auVar10);
      auVar10 = vshufpd_avx(auVar10,auVar10,1);
      auVar10 = vmaxss_avx(auVar10,auVar11);
      lVar21 = (long)iVar101 * 0x44;
      auVar11 = vmovshdup_avx(auVar168);
      uVar109 = auVar11._0_8_;
      local_580._8_8_ = uVar109;
      local_580._0_8_ = uVar109;
      local_580._16_8_ = uVar109;
      local_580._24_8_ = uVar109;
      auVar12 = vmovshdup_avx(auVar185);
      uVar109 = auVar12._0_8_;
      local_5a0._8_8_ = uVar109;
      local_5a0._0_8_ = uVar109;
      local_5a0._16_8_ = uVar109;
      local_5a0._24_8_ = uVar109;
      auVar187 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x908);
      uVar209 = auVar186._0_4_;
      local_7a0._4_4_ = uVar209;
      local_7a0._0_4_ = uVar209;
      local_7a0._8_4_ = uVar209;
      local_7a0._12_4_ = uVar209;
      local_7a0._16_4_ = uVar209;
      local_7a0._20_4_ = uVar209;
      local_7a0._24_4_ = uVar209;
      local_7a0._28_4_ = uVar209;
      auVar12 = vmovshdup_avx(auVar186);
      uVar109 = auVar12._0_8_;
      local_6c0._8_8_ = uVar109;
      local_6c0._0_8_ = uVar109;
      local_6c0._16_8_ = uVar109;
      local_6c0._24_8_ = uVar109;
      fVar147 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar21 + 0xd8c);
      auVar99 = *(undefined1 (*) [28])(bspline_basis0 + lVar21 + 0xd8c);
      local_560 = auVar191._0_4_;
      auVar12 = vmovshdup_avx(auVar191);
      uVar109 = auVar12._0_8_;
      auVar24._4_4_ = local_560 * *(float *)(bspline_basis0 + lVar21 + 0xd90);
      auVar24._0_4_ = local_560 * fVar147;
      auVar24._8_4_ = local_560 * *(float *)(bspline_basis0 + lVar21 + 0xd94);
      auVar24._12_4_ = local_560 * *(float *)(bspline_basis0 + lVar21 + 0xd98);
      auVar24._16_4_ = local_560 * *(float *)(bspline_basis0 + lVar21 + 0xd9c);
      auVar24._20_4_ = local_560 * *(float *)(bspline_basis0 + lVar21 + 0xda0);
      auVar24._24_4_ = local_560 * *(float *)(bspline_basis0 + lVar21 + 0xda4);
      auVar24._28_4_ = *(undefined4 *)(bspline_basis0 + lVar21 + 0xda8);
      auVar110 = vfmadd231ps_fma(auVar24,auVar187,local_7a0);
      local_780 = auVar12._0_4_;
      auVar217._0_4_ = local_780 * fVar147;
      fStack_77c = auVar12._4_4_;
      auVar217._4_4_ = fStack_77c * *(float *)(bspline_basis0 + lVar21 + 0xd90);
      auVar217._8_4_ = local_780 * *(float *)(bspline_basis0 + lVar21 + 0xd94);
      auVar217._12_4_ = fStack_77c * *(float *)(bspline_basis0 + lVar21 + 0xd98);
      auVar217._16_4_ = local_780 * *(float *)(bspline_basis0 + lVar21 + 0xd9c);
      auVar217._20_4_ = fStack_77c * *(float *)(bspline_basis0 + lVar21 + 0xda0);
      auVar217._24_4_ = local_780 * *(float *)(bspline_basis0 + lVar21 + 0xda4);
      auVar217._28_4_ = 0;
      auVar12 = vfmadd231ps_fma(auVar217,auVar187,local_6c0);
      auVar118 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x484);
      uVar202 = auVar185._0_4_;
      auVar222._4_4_ = uVar202;
      auVar222._0_4_ = uVar202;
      auVar222._8_4_ = uVar202;
      auVar222._12_4_ = uVar202;
      auVar222._16_4_ = uVar202;
      auVar222._20_4_ = uVar202;
      auVar222._24_4_ = uVar202;
      auVar222._28_4_ = uVar202;
      auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar118,auVar222);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar118,local_5a0);
      auVar137 = *(undefined1 (*) [32])(bspline_basis0 + lVar21);
      uVar108 = auVar168._0_4_;
      auVar204._4_4_ = uVar108;
      auVar204._0_4_ = uVar108;
      auVar204._8_4_ = uVar108;
      auVar204._12_4_ = uVar108;
      auVar204._16_4_ = uVar108;
      auVar204._20_4_ = uVar108;
      auVar204._24_4_ = uVar108;
      auVar204._28_4_ = uVar108;
      auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar137,auVar204);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar137,local_580);
      auVar214 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x908);
      fVar147 = *(float *)*(undefined1 (*) [28])(bspline_basis1 + lVar21 + 0xd8c);
      fVar124 = *(float *)(bspline_basis1 + lVar21 + 0xd90);
      fVar93 = *(float *)(bspline_basis1 + lVar21 + 0xd94);
      fVar94 = *(float *)(bspline_basis1 + lVar21 + 0xd98);
      fVar95 = *(float *)(bspline_basis1 + lVar21 + 0xd9c);
      fVar146 = *(float *)(bspline_basis1 + lVar21 + 0xda0);
      fVar125 = *(float *)(bspline_basis1 + lVar21 + 0xda4);
      auVar100 = *(undefined1 (*) [28])(bspline_basis1 + lVar21 + 0xd8c);
      auVar25._4_4_ = local_560 * fVar124;
      auVar25._0_4_ = local_560 * fVar147;
      auVar25._8_4_ = local_560 * fVar93;
      auVar25._12_4_ = local_560 * fVar94;
      auVar25._16_4_ = local_560 * fVar95;
      auVar25._20_4_ = local_560 * fVar146;
      auVar25._24_4_ = local_560 * fVar125;
      auVar25._28_4_ = *(undefined4 *)(bspline_basis0 + lVar21 + 0xda8);
      auVar190 = vfmadd231ps_fma(auVar25,auVar214,local_7a0);
      auVar26._4_4_ = fStack_77c * fVar124;
      auVar26._0_4_ = local_780 * fVar147;
      auVar26._8_4_ = local_780 * fVar93;
      auVar26._12_4_ = fStack_77c * fVar94;
      auVar26._16_4_ = local_780 * fVar95;
      auVar26._20_4_ = fStack_77c * fVar146;
      auVar26._24_4_ = local_780 * fVar125;
      auVar26._28_4_ = uVar209;
      auVar23 = vfmadd231ps_fma(auVar26,auVar214,local_6c0);
      auVar19 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x484);
      auVar190 = vfmadd231ps_fma(ZEXT1632(auVar190),auVar19,auVar222);
      auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar19,local_5a0);
      auVar198 = *(undefined1 (*) [32])(bspline_basis1 + lVar21);
      auVar190 = vfmadd231ps_fma(ZEXT1632(auVar190),auVar198,auVar204);
      auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar198,local_580);
      local_480 = ZEXT1632(auVar190);
      local_460 = ZEXT1632(auVar110);
      auVar162 = vsubps_avx(local_480,local_460);
      local_4a0 = ZEXT1632(auVar23);
      local_4c0 = ZEXT1632(auVar12);
      local_500 = vsubps_avx(local_4a0,local_4c0);
      auVar113._0_4_ = auVar12._0_4_ * auVar162._0_4_;
      auVar113._4_4_ = auVar12._4_4_ * auVar162._4_4_;
      auVar113._8_4_ = auVar12._8_4_ * auVar162._8_4_;
      auVar113._12_4_ = auVar12._12_4_ * auVar162._12_4_;
      auVar113._16_4_ = auVar162._16_4_ * 0.0;
      auVar113._20_4_ = auVar162._20_4_ * 0.0;
      auVar113._24_4_ = auVar162._24_4_ * 0.0;
      auVar113._28_4_ = 0;
      fVar128 = local_500._0_4_;
      auVar133._0_4_ = fVar128 * auVar110._0_4_;
      fVar129 = local_500._4_4_;
      auVar133._4_4_ = fVar129 * auVar110._4_4_;
      fVar130 = local_500._8_4_;
      auVar133._8_4_ = fVar130 * auVar110._8_4_;
      fVar197 = local_500._12_4_;
      auVar133._12_4_ = fVar197 * auVar110._12_4_;
      fVar206 = local_500._16_4_;
      auVar133._16_4_ = fVar206 * 0.0;
      fVar207 = local_500._20_4_;
      auVar133._20_4_ = fVar207 * 0.0;
      fVar208 = local_500._24_4_;
      auVar133._24_4_ = fVar208 * 0.0;
      auVar133._28_4_ = 0;
      auVar18 = vsubps_avx(auVar113,auVar133);
      auVar12 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
      uVar131 = auVar12._0_8_;
      local_a0._8_8_ = uVar131;
      local_a0._0_8_ = uVar131;
      local_a0._16_8_ = uVar131;
      local_a0._24_8_ = uVar131;
      auVar110 = vpermilps_avx(auVar8,0xff);
      uVar131 = auVar110._0_8_;
      local_c0._8_8_ = uVar131;
      local_c0._0_8_ = uVar131;
      local_c0._16_8_ = uVar131;
      local_c0._24_8_ = uVar131;
      auVar110 = vpermilps_avx(auVar9,0xff);
      uVar131 = auVar110._0_8_;
      local_e0._8_8_ = uVar131;
      local_e0._0_8_ = uVar131;
      local_e0._16_8_ = uVar131;
      local_e0._24_8_ = uVar131;
      auVar110 = vpermilps_avx(auVar176,0xff);
      local_100 = auVar110._0_8_;
      local_940 = auVar99._0_4_;
      fStack_93c = auVar99._4_4_;
      fStack_938 = auVar99._8_4_;
      fStack_934 = auVar99._12_4_;
      fStack_930 = auVar99._16_4_;
      fStack_92c = auVar99._20_4_;
      fStack_928 = auVar99._24_4_;
      fVar126 = auVar110._0_4_;
      fVar127 = auVar110._4_4_;
      auVar27._4_4_ = fVar127 * fStack_93c;
      auVar27._0_4_ = fVar126 * local_940;
      auVar27._8_4_ = fVar126 * fStack_938;
      auVar27._12_4_ = fVar127 * fStack_934;
      auVar27._16_4_ = fVar126 * fStack_930;
      auVar27._20_4_ = fVar127 * fStack_92c;
      auVar27._24_4_ = fVar126 * fStack_928;
      auVar27._28_4_ = auVar11._4_4_;
      auVar11 = vfmadd231ps_fma(auVar27,local_e0,auVar187);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar118,local_c0);
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar137,local_a0);
      uStack_f8 = local_100;
      uStack_f0 = local_100;
      uStack_e8 = local_100;
      auVar28._4_4_ = fVar127 * fVar124;
      auVar28._0_4_ = fVar126 * fVar147;
      auVar28._8_4_ = fVar126 * fVar93;
      auVar28._12_4_ = fVar127 * fVar94;
      auVar28._16_4_ = fVar126 * fVar95;
      auVar28._20_4_ = fVar127 * fVar146;
      auVar28._24_4_ = fVar126 * fVar125;
      auVar28._28_4_ = fVar127;
      auVar110 = vfmadd231ps_fma(auVar28,auVar214,local_e0);
      auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar19,local_c0);
      auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar198,local_a0);
      auVar29._4_4_ = fVar129 * fVar129;
      auVar29._0_4_ = fVar128 * fVar128;
      auVar29._8_4_ = fVar130 * fVar130;
      auVar29._12_4_ = fVar197 * fVar197;
      auVar29._16_4_ = fVar206 * fVar206;
      auVar29._20_4_ = fVar207 * fVar207;
      auVar29._24_4_ = fVar208 * fVar208;
      auVar29._28_4_ = auVar12._4_4_;
      auVar12 = vfmadd231ps_fma(auVar29,auVar162,auVar162);
      auVar227 = ZEXT1632(auVar11);
      auVar20 = vmaxps_avx(auVar227,ZEXT1632(auVar110));
      auVar30._4_4_ = auVar20._4_4_ * auVar20._4_4_ * auVar12._4_4_;
      auVar30._0_4_ = auVar20._0_4_ * auVar20._0_4_ * auVar12._0_4_;
      auVar30._8_4_ = auVar20._8_4_ * auVar20._8_4_ * auVar12._8_4_;
      auVar30._12_4_ = auVar20._12_4_ * auVar20._12_4_ * auVar12._12_4_;
      auVar30._16_4_ = auVar20._16_4_ * auVar20._16_4_ * 0.0;
      auVar30._20_4_ = auVar20._20_4_ * auVar20._20_4_ * 0.0;
      auVar30._24_4_ = auVar20._24_4_ * auVar20._24_4_ * 0.0;
      auVar30._28_4_ = auVar20._28_4_;
      auVar31._4_4_ = auVar18._4_4_ * auVar18._4_4_;
      auVar31._0_4_ = auVar18._0_4_ * auVar18._0_4_;
      auVar31._8_4_ = auVar18._8_4_ * auVar18._8_4_;
      auVar31._12_4_ = auVar18._12_4_ * auVar18._12_4_;
      auVar31._16_4_ = auVar18._16_4_ * auVar18._16_4_;
      auVar31._20_4_ = auVar18._20_4_ * auVar18._20_4_;
      auVar31._24_4_ = auVar18._24_4_ * auVar18._24_4_;
      auVar31._28_4_ = auVar18._28_4_;
      auVar20 = vcmpps_avx(auVar31,auVar30,2);
      fVar147 = auVar10._0_4_ * 4.7683716e-07;
      auVar114._0_4_ = (float)iVar101;
      local_5c0._4_12_ = auVar191._4_12_;
      local_5c0._0_4_ = auVar114._0_4_;
      local_5c0._16_16_ = auVar120._16_16_;
      auVar114._4_4_ = auVar114._0_4_;
      auVar114._8_4_ = auVar114._0_4_;
      auVar114._12_4_ = auVar114._0_4_;
      auVar114._16_4_ = auVar114._0_4_;
      auVar114._20_4_ = auVar114._0_4_;
      auVar114._24_4_ = auVar114._0_4_;
      auVar114._28_4_ = auVar114._0_4_;
      auVar120 = vcmpps_avx(_DAT_01faff40,auVar114,1);
      auVar10 = vpermilps_avx(auVar168,0xaa);
      uVar131 = auVar10._0_8_;
      local_6e0._8_8_ = uVar131;
      local_6e0._0_8_ = uVar131;
      local_6e0._16_8_ = uVar131;
      local_6e0._24_8_ = uVar131;
      auVar10 = vpermilps_avx(auVar185,0xaa);
      uVar131 = auVar10._0_8_;
      auVar195._8_8_ = uVar131;
      auVar195._0_8_ = uVar131;
      auVar195._16_8_ = uVar131;
      auVar195._24_8_ = uVar131;
      auVar10 = vpermilps_avx(auVar186,0xaa);
      uVar131 = auVar10._0_8_;
      auVar179._8_8_ = uVar131;
      auVar179._0_8_ = uVar131;
      auVar179._16_8_ = uVar131;
      auVar179._24_8_ = uVar131;
      auVar10 = vshufps_avx(auVar191,auVar191,0xaa);
      uVar131 = auVar10._0_8_;
      register0x00001508 = uVar131;
      local_760 = uVar131;
      register0x00001510 = uVar131;
      register0x00001518 = uVar131;
      auVar216 = ZEXT3264(_local_760);
      auVar18 = auVar120 & auVar20;
      uVar104 = *(uint *)(ray + k * 4 + 0x60);
      local_720._0_16_ = ZEXT416(uVar104);
      local_8b0 = auVar8._0_8_;
      uStack_8a8 = auVar8._8_8_;
      local_8c0 = auVar9._0_8_;
      uStack_8b8 = auVar9._8_8_;
      local_8d0._0_4_ = auVar176._0_4_;
      fVar124 = (float)local_8d0;
      local_8d0._4_4_ = auVar176._4_4_;
      fVar93 = local_8d0._4_4_;
      uStack_8c8._0_4_ = auVar176._8_4_;
      fVar94 = (float)uStack_8c8;
      uStack_8c8._4_4_ = auVar176._12_4_;
      fVar95 = uStack_8c8._4_4_;
      local_8d0 = auVar176._0_8_;
      uStack_8c8 = auVar176._8_8_;
      fStack_778 = local_780;
      fStack_774 = fStack_77c;
      fStack_770 = local_780;
      fStack_76c = fStack_77c;
      fStack_768 = local_780;
      fStack_764 = fStack_77c;
      fStack_55c = local_560;
      fStack_558 = local_560;
      fStack_554 = local_560;
      fStack_550 = local_560;
      fStack_54c = local_560;
      fStack_548 = local_560;
      fStack_544 = local_560;
      if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar18 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar18 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar18 >> 0x7f,0) == '\0') &&
            (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar18 >> 0xbf,0) == '\0') &&
          (auVar18 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar18[0x1f])
      {
        auVar212 = ZEXT3264(CONCAT428(fStack_77c,
                                      CONCAT424(local_780,
                                                CONCAT420(fStack_77c,
                                                          CONCAT416(local_780,
                                                                    CONCAT412(fStack_77c,
                                                                              CONCAT48(local_780,
                                                                                       uVar109))))))
                           );
      }
      else {
        local_640 = (uint)pGVar14;
        uStack_63c = (uint)((ulong)pGVar14 >> 0x20);
        _local_4e0 = vandps_avx(auVar20,auVar120);
        local_5e0._0_4_ = auVar100._0_4_;
        local_5e0._4_4_ = auVar100._4_4_;
        fStack_5d8 = auVar100._8_4_;
        fStack_5d4 = auVar100._12_4_;
        fStack_5d0 = auVar100._16_4_;
        fStack_5cc = auVar100._20_4_;
        fStack_5c8 = auVar100._24_4_;
        fVar197 = auVar10._0_4_;
        fVar206 = auVar10._4_4_;
        auVar32._4_4_ = fVar206 * (float)local_5e0._4_4_;
        auVar32._0_4_ = fVar197 * (float)local_5e0._0_4_;
        auVar32._8_4_ = fVar197 * fStack_5d8;
        auVar32._12_4_ = fVar206 * fStack_5d4;
        auVar32._16_4_ = fVar197 * fStack_5d0;
        auVar32._20_4_ = fVar206 * fStack_5cc;
        auVar32._24_4_ = fVar197 * fStack_5c8;
        auVar32._28_4_ = local_4e0._28_4_;
        auVar176 = vfmadd213ps_fma(auVar214,auVar179,auVar32);
        auVar176 = vfmadd213ps_fma(auVar19,auVar195,ZEXT1632(auVar176));
        auVar176 = vfmadd213ps_fma(auVar198,local_6e0,ZEXT1632(auVar176));
        _local_5e0 = ZEXT1632(auVar176);
        auVar33._4_4_ = fVar206 * fStack_93c;
        auVar33._0_4_ = fVar197 * local_940;
        auVar33._8_4_ = fVar197 * fStack_938;
        auVar33._12_4_ = fVar206 * fStack_934;
        auVar33._16_4_ = fVar197 * fStack_930;
        auVar33._20_4_ = fVar206 * fStack_92c;
        auVar33._24_4_ = fVar197 * fStack_928;
        auVar33._28_4_ = local_4e0._28_4_;
        auVar176 = vfmadd213ps_fma(auVar187,auVar179,auVar33);
        auVar176 = vfmadd213ps_fma(auVar118,auVar195,ZEXT1632(auVar176));
        auVar120 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x1210);
        auVar187 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x1694);
        auVar118 = *(undefined1 (*) [32])(bspline_basis0 + lVar21 + 0x1b18);
        fVar146 = *(float *)(bspline_basis0 + lVar21 + 0x1f9c);
        fVar125 = *(float *)(bspline_basis0 + lVar21 + 0x1fa0);
        fVar126 = *(float *)(bspline_basis0 + lVar21 + 0x1fa4);
        fVar127 = *(float *)(bspline_basis0 + lVar21 + 0x1fa8);
        fVar128 = *(float *)(bspline_basis0 + lVar21 + 0x1fac);
        fVar129 = *(float *)(bspline_basis0 + lVar21 + 0x1fb0);
        fVar130 = *(float *)(bspline_basis0 + lVar21 + 0x1fb4);
        auVar34._4_4_ = local_560 * fVar125;
        auVar34._0_4_ = local_560 * fVar146;
        auVar34._8_4_ = local_560 * fVar126;
        auVar34._12_4_ = local_560 * fVar127;
        auVar34._16_4_ = local_560 * fVar128;
        auVar34._20_4_ = local_560 * fVar129;
        auVar34._24_4_ = local_560 * fVar130;
        auVar34._28_4_ = uVar202;
        auVar35._4_4_ = fStack_77c * fVar125;
        auVar35._0_4_ = local_780 * fVar146;
        auVar35._8_4_ = local_780 * fVar126;
        auVar35._12_4_ = fStack_77c * fVar127;
        auVar35._16_4_ = local_780 * fVar128;
        auVar35._20_4_ = fStack_77c * fVar129;
        auVar35._24_4_ = local_780 * fVar130;
        auVar35._28_4_ = auVar214._28_4_;
        auVar36._4_4_ = fVar125 * fVar206;
        auVar36._0_4_ = fVar146 * fVar197;
        auVar36._8_4_ = fVar126 * fVar197;
        auVar36._12_4_ = fVar127 * fVar206;
        auVar36._16_4_ = fVar128 * fVar197;
        auVar36._20_4_ = fVar129 * fVar206;
        auVar36._24_4_ = fVar130 * fVar197;
        auVar36._28_4_ = local_500._28_4_;
        auVar10 = vfmadd231ps_fma(auVar34,auVar118,local_7a0);
        auVar11 = vfmadd231ps_fma(auVar35,auVar118,local_6c0);
        auVar12 = vfmadd231ps_fma(auVar36,auVar179,auVar118);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar187,auVar222);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar187,local_5a0);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar195,auVar187);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar120,auVar204);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar120,local_580);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar120,local_6e0);
        fVar146 = *(float *)(bspline_basis1 + lVar21 + 0x1f9c);
        fVar125 = *(float *)(bspline_basis1 + lVar21 + 0x1fa0);
        fVar126 = *(float *)(bspline_basis1 + lVar21 + 0x1fa4);
        fVar127 = *(float *)(bspline_basis1 + lVar21 + 0x1fa8);
        fVar128 = *(float *)(bspline_basis1 + lVar21 + 0x1fac);
        fVar129 = *(float *)(bspline_basis1 + lVar21 + 0x1fb0);
        fVar130 = *(float *)(bspline_basis1 + lVar21 + 0x1fb4);
        auVar187._4_4_ = local_560 * fVar125;
        auVar187._0_4_ = local_560 * fVar146;
        auVar187._8_4_ = local_560 * fVar126;
        auVar187._12_4_ = local_560 * fVar127;
        auVar187._16_4_ = local_560 * fVar128;
        auVar187._20_4_ = local_560 * fVar129;
        auVar187._24_4_ = local_560 * fVar130;
        auVar187._28_4_ = local_560;
        auVar37._4_4_ = fStack_77c * fVar125;
        auVar37._0_4_ = local_780 * fVar146;
        auVar37._8_4_ = local_780 * fVar126;
        auVar37._12_4_ = fStack_77c * fVar127;
        auVar37._16_4_ = local_780 * fVar128;
        auVar37._20_4_ = fStack_77c * fVar129;
        auVar37._24_4_ = local_780 * fVar130;
        auVar37._28_4_ = fStack_77c;
        auVar38._4_4_ = fVar206 * fVar125;
        auVar38._0_4_ = fVar197 * fVar146;
        auVar38._8_4_ = fVar197 * fVar126;
        auVar38._12_4_ = fVar206 * fVar127;
        auVar38._16_4_ = fVar197 * fVar128;
        auVar38._20_4_ = fVar206 * fVar129;
        auVar38._24_4_ = fVar197 * fVar130;
        auVar38._28_4_ = fVar206;
        auVar120 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x1b18);
        auVar190 = vfmadd231ps_fma(auVar187,auVar120,local_7a0);
        auVar168 = vfmadd231ps_fma(auVar37,auVar120,local_6c0);
        auVar185 = vfmadd231ps_fma(auVar38,auVar179,auVar120);
        auVar120 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x1694);
        auVar190 = vfmadd231ps_fma(ZEXT1632(auVar190),auVar120,auVar222);
        auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar120,local_5a0);
        auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),auVar120,auVar195);
        auVar120 = *(undefined1 (*) [32])(bspline_basis1 + lVar21 + 0x1210);
        auVar190 = vfmadd231ps_fma(ZEXT1632(auVar190),auVar120,auVar204);
        auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar120,local_580);
        auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),local_6e0,auVar120);
        auVar120 = vandps_avx(local_2c0,ZEXT1632(auVar10));
        auVar187 = vandps_avx(ZEXT1632(auVar11),local_2c0);
        auVar187 = vmaxps_avx(auVar120,auVar187);
        auVar120 = vandps_avx(ZEXT1632(auVar12),local_2c0);
        auVar120 = vmaxps_avx(auVar187,auVar120);
        auVar134._4_4_ = fVar147;
        auVar134._0_4_ = fVar147;
        auVar134._8_4_ = fVar147;
        auVar134._12_4_ = fVar147;
        auVar134._16_4_ = fVar147;
        auVar134._20_4_ = fVar147;
        auVar134._24_4_ = fVar147;
        auVar134._28_4_ = fVar147;
        auVar120 = vcmpps_avx(auVar120,auVar134,1);
        auVar118 = vblendvps_avx(ZEXT1632(auVar10),auVar162,auVar120);
        auVar214 = vblendvps_avx(ZEXT1632(auVar11),local_500,auVar120);
        auVar120 = vandps_avx(ZEXT1632(auVar190),local_2c0);
        auVar187 = vandps_avx(ZEXT1632(auVar168),local_2c0);
        auVar187 = vmaxps_avx(auVar120,auVar187);
        auVar120 = vandps_avx(ZEXT1632(auVar185),local_2c0);
        auVar120 = vmaxps_avx(auVar187,auVar120);
        auVar187 = vcmpps_avx(auVar120,auVar134,1);
        auVar120 = vblendvps_avx(ZEXT1632(auVar190),auVar162,auVar187);
        auVar187 = vblendvps_avx(ZEXT1632(auVar168),local_500,auVar187);
        auVar176 = vfmadd213ps_fma(auVar137,local_6e0,ZEXT1632(auVar176));
        fVar197 = -auVar120._4_4_;
        auVar10 = vfmadd213ps_fma(auVar118,auVar118,ZEXT832(0) << 0x20);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar214,auVar214);
        auVar137 = vrsqrtps_avx(ZEXT1632(auVar10));
        fVar146 = auVar137._0_4_;
        fVar125 = auVar137._4_4_;
        fVar126 = auVar137._8_4_;
        fVar127 = auVar137._12_4_;
        fVar128 = auVar137._16_4_;
        fVar129 = auVar137._20_4_;
        fVar130 = auVar137._24_4_;
        auVar39._4_4_ = fVar125 * fVar125 * fVar125 * auVar10._4_4_ * -0.5;
        auVar39._0_4_ = fVar146 * fVar146 * fVar146 * auVar10._0_4_ * -0.5;
        auVar39._8_4_ = fVar126 * fVar126 * fVar126 * auVar10._8_4_ * -0.5;
        auVar39._12_4_ = fVar127 * fVar127 * fVar127 * auVar10._12_4_ * -0.5;
        auVar39._16_4_ = fVar128 * fVar128 * fVar128 * -0.0;
        auVar39._20_4_ = fVar129 * fVar129 * fVar129 * -0.0;
        auVar39._24_4_ = fVar130 * fVar130 * fVar130 * -0.0;
        auVar39._28_4_ = 0;
        auVar218._8_4_ = 0x3fc00000;
        auVar218._0_8_ = 0x3fc000003fc00000;
        auVar218._12_4_ = 0x3fc00000;
        auVar218._16_4_ = 0x3fc00000;
        auVar218._20_4_ = 0x3fc00000;
        auVar218._24_4_ = 0x3fc00000;
        auVar218._28_4_ = 0x3fc00000;
        auVar10 = vfmadd231ps_fma(auVar39,auVar218,auVar137);
        fVar146 = auVar10._0_4_;
        fVar125 = auVar10._4_4_;
        auVar40._4_4_ = auVar214._4_4_ * fVar125;
        auVar40._0_4_ = auVar214._0_4_ * fVar146;
        fVar126 = auVar10._8_4_;
        auVar40._8_4_ = auVar214._8_4_ * fVar126;
        fVar127 = auVar10._12_4_;
        auVar40._12_4_ = auVar214._12_4_ * fVar127;
        auVar40._16_4_ = auVar214._16_4_ * 0.0;
        auVar40._20_4_ = auVar214._20_4_ * 0.0;
        auVar40._24_4_ = auVar214._24_4_ * 0.0;
        auVar40._28_4_ = auVar137._28_4_;
        auVar41._4_4_ = -auVar118._4_4_ * fVar125;
        auVar41._0_4_ = -auVar118._0_4_ * fVar146;
        auVar41._8_4_ = -auVar118._8_4_ * fVar126;
        auVar41._12_4_ = -auVar118._12_4_ * fVar127;
        auVar41._16_4_ = -auVar118._16_4_ * 0.0;
        auVar41._20_4_ = -auVar118._20_4_ * 0.0;
        auVar41._24_4_ = -auVar118._24_4_ * 0.0;
        auVar41._28_4_ = 0;
        auVar10 = vfmadd213ps_fma(auVar120,auVar120,ZEXT832(0) << 0x20);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar187,auVar187);
        auVar118 = vrsqrtps_avx(ZEXT1632(auVar10));
        auVar137 = ZEXT1632(CONCAT412(fVar127 * 0.0,
                                      CONCAT48(fVar126 * 0.0,CONCAT44(fVar125 * 0.0,fVar146 * 0.0)))
                           );
        fVar146 = auVar118._0_4_;
        fVar125 = auVar118._4_4_;
        fVar126 = auVar118._8_4_;
        fVar127 = auVar118._12_4_;
        fVar128 = auVar118._16_4_;
        fVar129 = auVar118._20_4_;
        fVar130 = auVar118._24_4_;
        auVar42._4_4_ = fVar125 * fVar125 * fVar125 * auVar10._4_4_ * -0.5;
        auVar42._0_4_ = fVar146 * fVar146 * fVar146 * auVar10._0_4_ * -0.5;
        auVar42._8_4_ = fVar126 * fVar126 * fVar126 * auVar10._8_4_ * -0.5;
        auVar42._12_4_ = fVar127 * fVar127 * fVar127 * auVar10._12_4_ * -0.5;
        auVar42._16_4_ = fVar128 * fVar128 * fVar128 * -0.0;
        auVar42._20_4_ = fVar129 * fVar129 * fVar129 * -0.0;
        auVar42._24_4_ = fVar130 * fVar130 * fVar130 * -0.0;
        auVar42._28_4_ = 0xbf000000;
        auVar10 = vfmadd231ps_fma(auVar42,auVar218,auVar118);
        fVar146 = auVar10._0_4_;
        fVar125 = auVar10._4_4_;
        auVar43._4_4_ = fVar125 * auVar187._4_4_;
        auVar43._0_4_ = fVar146 * auVar187._0_4_;
        fVar126 = auVar10._8_4_;
        auVar43._8_4_ = fVar126 * auVar187._8_4_;
        fVar127 = auVar10._12_4_;
        auVar43._12_4_ = fVar127 * auVar187._12_4_;
        auVar43._16_4_ = auVar187._16_4_ * 0.0;
        auVar43._20_4_ = auVar187._20_4_ * 0.0;
        auVar43._24_4_ = auVar187._24_4_ * 0.0;
        auVar43._28_4_ = 0;
        auVar44._4_4_ = fVar125 * fVar197;
        auVar44._0_4_ = fVar146 * -auVar120._0_4_;
        auVar44._8_4_ = fVar126 * -auVar120._8_4_;
        auVar44._12_4_ = fVar127 * -auVar120._12_4_;
        auVar44._16_4_ = -auVar120._16_4_ * 0.0;
        auVar44._20_4_ = -auVar120._20_4_ * 0.0;
        auVar44._24_4_ = -auVar120._24_4_ * 0.0;
        auVar44._28_4_ = 0x3fc00000;
        auVar45._28_4_ = auVar118._28_4_;
        auVar45._0_28_ =
             ZEXT1628(CONCAT412(fVar127 * 0.0,
                                CONCAT48(fVar126 * 0.0,CONCAT44(fVar125 * 0.0,fVar146 * 0.0))));
        auVar10 = vfmadd213ps_fma(auVar40,auVar227,local_460);
        auVar11 = vfmadd213ps_fma(auVar41,auVar227,local_4c0);
        auVar12 = vfmadd213ps_fma(auVar137,auVar227,ZEXT1632(auVar176));
        auVar191 = vfnmadd213ps_fma(auVar40,auVar227,local_460);
        auVar190 = vfmadd213ps_fma(auVar43,ZEXT1632(auVar110),local_480);
        auVar23 = vfnmadd213ps_fma(auVar41,auVar227,local_4c0);
        auVar187 = ZEXT1632(auVar110);
        auVar168 = vfmadd213ps_fma(auVar44,auVar187,local_4a0);
        auVar210 = vfnmadd231ps_fma(ZEXT1632(auVar176),auVar227,auVar137);
        auVar185 = vfmadd213ps_fma(auVar45,auVar187,_local_5e0);
        auVar192 = vfnmadd213ps_fma(auVar43,auVar187,local_480);
        auVar203 = vfnmadd213ps_fma(auVar44,auVar187,local_4a0);
        auVar213 = vfnmadd231ps_fma(_local_5e0,ZEXT1632(auVar110),auVar45);
        auVar187 = vsubps_avx(ZEXT1632(auVar168),ZEXT1632(auVar23));
        auVar118 = vsubps_avx(ZEXT1632(auVar185),ZEXT1632(auVar210));
        auVar160._0_4_ = auVar210._0_4_ * auVar187._0_4_;
        auVar160._4_4_ = auVar210._4_4_ * auVar187._4_4_;
        auVar160._8_4_ = auVar210._8_4_ * auVar187._8_4_;
        auVar160._12_4_ = auVar210._12_4_ * auVar187._12_4_;
        auVar160._16_4_ = auVar187._16_4_ * 0.0;
        auVar160._20_4_ = auVar187._20_4_ * 0.0;
        auVar160._24_4_ = auVar187._24_4_ * 0.0;
        auVar160._28_4_ = 0;
        auVar186 = vfmsub231ps_fma(auVar160,ZEXT1632(auVar23),auVar118);
        auVar46._4_4_ = auVar191._4_4_ * auVar118._4_4_;
        auVar46._0_4_ = auVar191._0_4_ * auVar118._0_4_;
        auVar46._8_4_ = auVar191._8_4_ * auVar118._8_4_;
        auVar46._12_4_ = auVar191._12_4_ * auVar118._12_4_;
        auVar46._16_4_ = auVar118._16_4_ * 0.0;
        auVar46._20_4_ = auVar118._20_4_ * 0.0;
        auVar46._24_4_ = auVar118._24_4_ * 0.0;
        auVar46._28_4_ = auVar118._28_4_;
        auVar198 = ZEXT1632(auVar191);
        auVar118 = vsubps_avx(ZEXT1632(auVar190),auVar198);
        auVar176 = vfmsub231ps_fma(auVar46,ZEXT1632(auVar210),auVar118);
        auVar47._4_4_ = auVar23._4_4_ * auVar118._4_4_;
        auVar47._0_4_ = auVar23._0_4_ * auVar118._0_4_;
        auVar47._8_4_ = auVar23._8_4_ * auVar118._8_4_;
        auVar47._12_4_ = auVar23._12_4_ * auVar118._12_4_;
        auVar47._16_4_ = auVar118._16_4_ * 0.0;
        auVar47._20_4_ = auVar118._20_4_ * 0.0;
        auVar47._24_4_ = auVar118._24_4_ * 0.0;
        auVar47._28_4_ = auVar118._28_4_;
        auVar191 = vfmsub231ps_fma(auVar47,auVar198,auVar187);
        auVar92._4_8_ = 0;
        auVar92._0_4_ = (uint)-auVar120._4_4_ ^ (uint)fVar197;
        auVar176 = vfmadd231ps_fma(ZEXT1632(auVar191),ZEXT1232(auVar92) << 0x20,ZEXT1632(auVar176));
        auVar176 = vfmadd231ps_fma(ZEXT1632(auVar176),ZEXT1232(auVar92) << 0x20,ZEXT1632(auVar186));
        auVar18 = vcmpps_avx(ZEXT1632(auVar176),ZEXT1232(auVar92) << 0x20,2);
        auVar120 = vblendvps_avx(ZEXT1632(auVar192),ZEXT1632(auVar10),auVar18);
        auVar187 = vblendvps_avx(ZEXT1632(auVar203),ZEXT1632(auVar11),auVar18);
        auVar118 = vblendvps_avx(ZEXT1632(auVar213),ZEXT1632(auVar12),auVar18);
        auVar137 = vblendvps_avx(auVar198,ZEXT1632(auVar190),auVar18);
        auVar214 = vblendvps_avx(ZEXT1632(auVar23),ZEXT1632(auVar168),auVar18);
        auVar19 = vblendvps_avx(ZEXT1632(auVar210),ZEXT1632(auVar185),auVar18);
        auVar198 = vblendvps_avx(ZEXT1632(auVar190),auVar198,auVar18);
        auVar20 = vblendvps_avx(ZEXT1632(auVar168),ZEXT1632(auVar23),auVar18);
        auVar176 = vpackssdw_avx(local_4e0._0_16_,local_4e0._16_16_);
        auVar162 = vblendvps_avx(ZEXT1632(auVar185),ZEXT1632(auVar210),auVar18);
        auVar132 = vsubps_avx(auVar198,auVar120);
        auVar20 = vsubps_avx(auVar20,auVar187);
        auVar158 = vsubps_avx(auVar162,auVar118);
        auVar159 = vsubps_avx(auVar120,auVar137);
        auVar121 = vsubps_avx(auVar187,auVar214);
        auVar193 = vsubps_avx(auVar118,auVar19);
        auVar48._4_4_ = auVar158._4_4_ * auVar120._4_4_;
        auVar48._0_4_ = auVar158._0_4_ * auVar120._0_4_;
        auVar48._8_4_ = auVar158._8_4_ * auVar120._8_4_;
        auVar48._12_4_ = auVar158._12_4_ * auVar120._12_4_;
        auVar48._16_4_ = auVar158._16_4_ * auVar120._16_4_;
        auVar48._20_4_ = auVar158._20_4_ * auVar120._20_4_;
        auVar48._24_4_ = auVar158._24_4_ * auVar120._24_4_;
        auVar48._28_4_ = auVar162._28_4_;
        auVar10 = vfmsub231ps_fma(auVar48,auVar118,auVar132);
        auVar49._4_4_ = auVar132._4_4_ * auVar187._4_4_;
        auVar49._0_4_ = auVar132._0_4_ * auVar187._0_4_;
        auVar49._8_4_ = auVar132._8_4_ * auVar187._8_4_;
        auVar49._12_4_ = auVar132._12_4_ * auVar187._12_4_;
        auVar49._16_4_ = auVar132._16_4_ * auVar187._16_4_;
        auVar49._20_4_ = auVar132._20_4_ * auVar187._20_4_;
        auVar49._24_4_ = auVar132._24_4_ * auVar187._24_4_;
        auVar49._28_4_ = auVar198._28_4_;
        auVar11 = vfmsub231ps_fma(auVar49,auVar120,auVar20);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
        auVar115._0_4_ = auVar20._0_4_ * auVar118._0_4_;
        auVar115._4_4_ = auVar20._4_4_ * auVar118._4_4_;
        auVar115._8_4_ = auVar20._8_4_ * auVar118._8_4_;
        auVar115._12_4_ = auVar20._12_4_ * auVar118._12_4_;
        auVar115._16_4_ = auVar20._16_4_ * auVar118._16_4_;
        auVar115._20_4_ = auVar20._20_4_ * auVar118._20_4_;
        auVar115._24_4_ = auVar20._24_4_ * auVar118._24_4_;
        auVar115._28_4_ = 0;
        auVar11 = vfmsub231ps_fma(auVar115,auVar187,auVar158);
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
        auVar116._0_4_ = auVar193._0_4_ * auVar137._0_4_;
        auVar116._4_4_ = auVar193._4_4_ * auVar137._4_4_;
        auVar116._8_4_ = auVar193._8_4_ * auVar137._8_4_;
        auVar116._12_4_ = auVar193._12_4_ * auVar137._12_4_;
        auVar116._16_4_ = auVar193._16_4_ * auVar137._16_4_;
        auVar116._20_4_ = auVar193._20_4_ * auVar137._20_4_;
        auVar116._24_4_ = auVar193._24_4_ * auVar137._24_4_;
        auVar116._28_4_ = 0;
        auVar10 = vfmsub231ps_fma(auVar116,auVar159,auVar19);
        auVar50._4_4_ = auVar121._4_4_ * auVar19._4_4_;
        auVar50._0_4_ = auVar121._0_4_ * auVar19._0_4_;
        auVar50._8_4_ = auVar121._8_4_ * auVar19._8_4_;
        auVar50._12_4_ = auVar121._12_4_ * auVar19._12_4_;
        auVar50._16_4_ = auVar121._16_4_ * auVar19._16_4_;
        auVar50._20_4_ = auVar121._20_4_ * auVar19._20_4_;
        auVar50._24_4_ = auVar121._24_4_ * auVar19._24_4_;
        auVar50._28_4_ = auVar19._28_4_;
        auVar12 = vfmsub231ps_fma(auVar50,auVar214,auVar193);
        auVar51._4_4_ = auVar159._4_4_ * auVar214._4_4_;
        auVar51._0_4_ = auVar159._0_4_ * auVar214._0_4_;
        auVar51._8_4_ = auVar159._8_4_ * auVar214._8_4_;
        auVar51._12_4_ = auVar159._12_4_ * auVar214._12_4_;
        auVar51._16_4_ = auVar159._16_4_ * auVar214._16_4_;
        auVar51._20_4_ = auVar159._20_4_ * auVar214._20_4_;
        auVar51._24_4_ = auVar159._24_4_ * auVar214._24_4_;
        auVar51._28_4_ = auVar214._28_4_;
        auVar190 = vfmsub231ps_fma(auVar51,auVar121,auVar137);
        auVar214 = ZEXT832(0) << 0x20;
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar190),auVar214,ZEXT1632(auVar10));
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar214,ZEXT1632(auVar12));
        auVar137 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar12));
        auVar137 = vcmpps_avx(auVar137,ZEXT832(0) << 0x20,2);
        auVar10 = vpackssdw_avx(auVar137._0_16_,auVar137._16_16_);
        auVar176 = vpand_avx(auVar176,auVar10);
        auVar137 = vpmovsxwd_avx2(auVar176);
        if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar137 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar137 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar137 >> 0x7f,0) == '\0') &&
              (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar137 >> 0xbf,0) == '\0') &&
            (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar137[0x1f]) {
LAB_017a165a:
          auVar181._8_8_ = local_680[1]._8_8_;
          auVar181._0_8_ = local_680[1]._0_8_;
          auVar181._16_8_ = local_680[1]._16_8_;
          auVar181._24_8_ = local_680[1]._24_8_;
          auVar212 = ZEXT3264(CONCAT428(fStack_77c,
                                        CONCAT424(local_780,
                                                  CONCAT420(fStack_77c,
                                                            CONCAT416(local_780,
                                                                      CONCAT412(fStack_77c,
                                                                                CONCAT48(local_780,
                                                                                         uVar109))))
                                                 )));
        }
        else {
          auVar52._4_4_ = auVar20._4_4_ * auVar193._4_4_;
          auVar52._0_4_ = auVar20._0_4_ * auVar193._0_4_;
          auVar52._8_4_ = auVar20._8_4_ * auVar193._8_4_;
          auVar52._12_4_ = auVar20._12_4_ * auVar193._12_4_;
          auVar52._16_4_ = auVar20._16_4_ * auVar193._16_4_;
          auVar52._20_4_ = auVar20._20_4_ * auVar193._20_4_;
          auVar52._24_4_ = auVar20._24_4_ * auVar193._24_4_;
          auVar52._28_4_ = auVar137._28_4_;
          auVar185 = vfmsub231ps_fma(auVar52,auVar121,auVar158);
          auVar135._0_4_ = auVar159._0_4_ * auVar158._0_4_;
          auVar135._4_4_ = auVar159._4_4_ * auVar158._4_4_;
          auVar135._8_4_ = auVar159._8_4_ * auVar158._8_4_;
          auVar135._12_4_ = auVar159._12_4_ * auVar158._12_4_;
          auVar135._16_4_ = auVar159._16_4_ * auVar158._16_4_;
          auVar135._20_4_ = auVar159._20_4_ * auVar158._20_4_;
          auVar135._24_4_ = auVar159._24_4_ * auVar158._24_4_;
          auVar135._28_4_ = 0;
          auVar168 = vfmsub231ps_fma(auVar135,auVar132,auVar193);
          auVar53._4_4_ = auVar132._4_4_ * auVar121._4_4_;
          auVar53._0_4_ = auVar132._0_4_ * auVar121._0_4_;
          auVar53._8_4_ = auVar132._8_4_ * auVar121._8_4_;
          auVar53._12_4_ = auVar132._12_4_ * auVar121._12_4_;
          auVar53._16_4_ = auVar132._16_4_ * auVar121._16_4_;
          auVar53._20_4_ = auVar132._20_4_ * auVar121._20_4_;
          auVar53._24_4_ = auVar132._24_4_ * auVar121._24_4_;
          auVar53._28_4_ = auVar132._28_4_;
          auVar186 = vfmsub231ps_fma(auVar53,auVar159,auVar20);
          auVar10 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar168),ZEXT1632(auVar186));
          auVar190 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar185),auVar214);
          auVar137 = vrcpps_avx(ZEXT1632(auVar190));
          auVar211._8_4_ = 0x3f800000;
          auVar211._0_8_ = 0x3f8000003f800000;
          auVar211._12_4_ = 0x3f800000;
          auVar211._16_4_ = 0x3f800000;
          auVar211._20_4_ = 0x3f800000;
          auVar211._24_4_ = 0x3f800000;
          auVar211._28_4_ = 0x3f800000;
          auVar10 = vfnmadd213ps_fma(auVar137,ZEXT1632(auVar190),auVar211);
          auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar137,auVar137);
          auVar54._4_4_ = auVar186._4_4_ * auVar118._4_4_;
          auVar54._0_4_ = auVar186._0_4_ * auVar118._0_4_;
          auVar54._8_4_ = auVar186._8_4_ * auVar118._8_4_;
          auVar54._12_4_ = auVar186._12_4_ * auVar118._12_4_;
          auVar54._16_4_ = auVar118._16_4_ * 0.0;
          auVar54._20_4_ = auVar118._20_4_ * 0.0;
          auVar54._24_4_ = auVar118._24_4_ * 0.0;
          auVar54._28_4_ = auVar118._28_4_;
          auVar168 = vfmadd231ps_fma(auVar54,auVar187,ZEXT1632(auVar168));
          auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),ZEXT1632(auVar185),auVar120);
          fVar146 = auVar10._0_4_;
          fVar125 = auVar10._4_4_;
          fVar126 = auVar10._8_4_;
          fVar127 = auVar10._12_4_;
          auVar55._28_4_ = auVar187._28_4_;
          auVar55._0_28_ =
               ZEXT1628(CONCAT412(fVar127 * auVar168._12_4_,
                                  CONCAT48(fVar126 * auVar168._8_4_,
                                           CONCAT44(fVar125 * auVar168._4_4_,
                                                    fVar146 * auVar168._0_4_))));
          auVar117._4_4_ = uVar104;
          auVar117._0_4_ = uVar104;
          auVar117._8_4_ = uVar104;
          auVar117._12_4_ = uVar104;
          auVar117._16_4_ = uVar104;
          auVar117._20_4_ = uVar104;
          auVar117._24_4_ = uVar104;
          auVar117._28_4_ = uVar104;
          uVar108 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar136._4_4_ = uVar108;
          auVar136._0_4_ = uVar108;
          auVar136._8_4_ = uVar108;
          auVar136._12_4_ = uVar108;
          auVar136._16_4_ = uVar108;
          auVar136._20_4_ = uVar108;
          auVar136._24_4_ = uVar108;
          auVar136._28_4_ = uVar108;
          auVar120 = vcmpps_avx(auVar117,auVar55,2);
          auVar187 = vcmpps_avx(auVar55,auVar136,2);
          auVar120 = vandps_avx(auVar187,auVar120);
          auVar10 = vpackssdw_avx(auVar120._0_16_,auVar120._16_16_);
          auVar176 = vpand_avx(auVar176,auVar10);
          auVar120 = vpmovsxwd_avx2(auVar176);
          if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar120 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar120 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar120 >> 0x7f,0) == '\0') &&
                (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar120 >> 0xbf,0) == '\0') &&
              (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar120[0x1f]) goto LAB_017a165a;
          auVar120 = vcmpps_avx(auVar214,ZEXT1632(auVar190),4);
          auVar10 = vpackssdw_avx(auVar120._0_16_,auVar120._16_16_);
          auVar176 = vpand_avx(auVar176,auVar10);
          auVar120 = vpmovsxwd_avx2(auVar176);
          auVar181._8_8_ = local_680[1]._8_8_;
          auVar181._0_8_ = local_680[1]._0_8_;
          auVar181._16_8_ = local_680[1]._16_8_;
          auVar181._24_8_ = local_680[1]._24_8_;
          auVar212 = ZEXT3264(CONCAT428(fStack_77c,
                                        CONCAT424(local_780,
                                                  CONCAT420(fStack_77c,
                                                            CONCAT416(local_780,
                                                                      CONCAT412(fStack_77c,
                                                                                CONCAT48(local_780,
                                                                                         uVar109))))
                                                 )));
          if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar120 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar120 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar120 >> 0x7f,0) != '\0') ||
                (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar120 >> 0xbf,0) != '\0') ||
              (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar120[0x1f] < '\0') {
            auVar118 = ZEXT1632(CONCAT412(fVar127 * auVar11._12_4_,
                                          CONCAT48(fVar126 * auVar11._8_4_,
                                                   CONCAT44(fVar125 * auVar11._4_4_,
                                                            fVar146 * auVar11._0_4_))));
            auVar137 = ZEXT1632(CONCAT412(fVar127 * auVar12._12_4_,
                                          CONCAT48(fVar126 * auVar12._8_4_,
                                                   CONCAT44(fVar125 * auVar12._4_4_,
                                                            fVar146 * auVar12._0_4_))));
            auVar180._8_4_ = 0x3f800000;
            auVar180._0_8_ = 0x3f8000003f800000;
            auVar180._12_4_ = 0x3f800000;
            auVar180._16_4_ = 0x3f800000;
            auVar180._20_4_ = 0x3f800000;
            auVar180._24_4_ = 0x3f800000;
            auVar180._28_4_ = 0x3f800000;
            auVar187 = vsubps_avx(auVar180,auVar118);
            _local_2a0 = vblendvps_avx(auVar187,auVar118,auVar18);
            auVar187 = vsubps_avx(auVar180,auVar137);
            local_520 = vblendvps_avx(auVar187,auVar137,auVar18);
            auVar181 = auVar120;
            local_600 = auVar55;
          }
        }
        auVar216 = ZEXT3264(_local_760);
        if ((((((((auVar181 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar181 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar181 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar181 >> 0x7f,0) != '\0') ||
              (auVar181 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar181 >> 0xbf,0) != '\0') ||
            (auVar181 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar181[0x1f] < '\0') {
          auVar120 = vsubps_avx(ZEXT1632(auVar110),auVar227);
          auVar176 = vfmadd213ps_fma(auVar120,_local_2a0,auVar227);
          fVar146 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar56._4_4_ = (auVar176._4_4_ + auVar176._4_4_) * fVar146;
          auVar56._0_4_ = (auVar176._0_4_ + auVar176._0_4_) * fVar146;
          auVar56._8_4_ = (auVar176._8_4_ + auVar176._8_4_) * fVar146;
          auVar56._12_4_ = (auVar176._12_4_ + auVar176._12_4_) * fVar146;
          auVar56._16_4_ = fVar146 * 0.0;
          auVar56._20_4_ = fVar146 * 0.0;
          auVar56._24_4_ = fVar146 * 0.0;
          auVar56._28_4_ = 0;
          auVar120 = vcmpps_avx(local_600,auVar56,6);
          auVar187 = auVar181 & auVar120;
          if ((((((((auVar187 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar187 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar187 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar187 >> 0x7f,0) != '\0') ||
                (auVar187 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar187 >> 0xbf,0) != '\0') ||
              (auVar187 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar187[0x1f] < '\0') {
            auVar138._8_4_ = 0xbf800000;
            auVar138._0_8_ = 0xbf800000bf800000;
            auVar138._12_4_ = 0xbf800000;
            auVar138._16_4_ = 0xbf800000;
            auVar138._20_4_ = 0xbf800000;
            auVar138._24_4_ = 0xbf800000;
            auVar138._28_4_ = 0xbf800000;
            auVar161._8_4_ = 0x40000000;
            auVar161._0_8_ = 0x4000000040000000;
            auVar161._12_4_ = 0x40000000;
            auVar161._16_4_ = 0x40000000;
            auVar161._20_4_ = 0x40000000;
            auVar161._24_4_ = 0x40000000;
            auVar161._28_4_ = 0x40000000;
            auVar176 = vfmadd213ps_fma(local_520,auVar161,auVar138);
            local_420 = _local_2a0;
            local_400 = ZEXT1632(auVar176);
            local_3e0 = local_600;
            local_3c0 = 0;
            local_3a0 = local_8b0;
            uStack_398 = uStack_8a8;
            local_390 = local_8c0;
            uStack_388 = uStack_8b8;
            local_380 = local_8d0;
            uStack_378 = uStack_8c8;
            auVar224 = ZEXT3264(auVar179);
            auVar196 = ZEXT3264(auVar195);
            local_520 = local_400;
            if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              local_6a0 = vandps_avx(auVar120,auVar181);
              fVar146 = 1.0 / auVar114._0_4_;
              local_340[0] = fVar146 * ((float)local_2a0._0_4_ + 0.0);
              local_340[1] = fVar146 * ((float)local_2a0._4_4_ + 1.0);
              local_340[2] = fVar146 * (fStack_298 + 2.0);
              local_340[3] = fVar146 * (fStack_294 + 3.0);
              fStack_330 = fVar146 * (fStack_290 + 4.0);
              fStack_32c = fVar146 * (fStack_28c + 5.0);
              fStack_328 = fVar146 * (fStack_288 + 6.0);
              fStack_324 = fStack_284 + 7.0;
              local_520._0_8_ = auVar176._0_8_;
              local_520._8_8_ = auVar176._8_8_;
              local_320 = local_520._0_8_;
              uStack_318 = local_520._8_8_;
              uStack_310 = 0;
              uStack_308 = 0;
              local_300 = local_600;
              auVar139._8_4_ = 0x7f800000;
              auVar139._0_8_ = 0x7f8000007f800000;
              auVar139._12_4_ = 0x7f800000;
              auVar139._16_4_ = 0x7f800000;
              auVar139._20_4_ = 0x7f800000;
              auVar139._24_4_ = 0x7f800000;
              auVar139._28_4_ = 0x7f800000;
              auVar120 = vblendvps_avx(auVar139,local_600,local_6a0);
              auVar187 = vshufps_avx(auVar120,auVar120,0xb1);
              auVar187 = vminps_avx(auVar120,auVar187);
              auVar118 = vshufpd_avx(auVar187,auVar187,5);
              auVar187 = vminps_avx(auVar187,auVar118);
              auVar118 = vpermpd_avx2(auVar187,0x4e);
              auVar187 = vminps_avx(auVar187,auVar118);
              auVar187 = vcmpps_avx(auVar120,auVar187,0);
              auVar118 = local_6a0 & auVar187;
              auVar120 = local_6a0;
              if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar118 >> 0x7f,0) != '\0') ||
                    (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar118 >> 0xbf,0) != '\0') ||
                  (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar118[0x1f] < '\0') {
                auVar120 = vandps_avx(auVar187,local_6a0);
              }
              uVar102 = vmovmskps_avx(auVar120);
              uVar104 = 0;
              for (; (uVar102 & 1) == 0; uVar102 = uVar102 >> 1 | 0x80000000) {
                uVar104 = uVar104 + 1;
              }
              uVar103 = (ulong)uVar104;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar146 = local_340[uVar103];
                uVar108 = *(undefined4 *)((long)&local_320 + uVar103 * 4);
                fVar125 = 1.0 - fVar146;
                auVar171 = ZEXT416((uint)(fVar146 * fVar125 * 4.0));
                auVar176 = vfnmsub213ss_fma(ZEXT416((uint)fVar146),ZEXT416((uint)fVar146),auVar171);
                auVar171 = vfmadd213ss_fma(ZEXT416((uint)fVar125),ZEXT416((uint)fVar125),auVar171);
                fVar125 = fVar125 * -fVar125 * 0.5;
                fVar126 = auVar176._0_4_ * 0.5;
                fVar127 = auVar171._0_4_ * 0.5;
                fVar128 = fVar146 * fVar146 * 0.5;
                auVar169._0_4_ = fVar128 * fVar124;
                auVar169._4_4_ = fVar128 * fVar93;
                auVar169._8_4_ = fVar128 * fVar94;
                auVar169._12_4_ = fVar128 * fVar95;
                auVar148._4_4_ = fVar127;
                auVar148._0_4_ = fVar127;
                auVar148._8_4_ = fVar127;
                auVar148._12_4_ = fVar127;
                auVar171 = vfmadd132ps_fma(auVar148,auVar169,auVar9);
                auVar170._4_4_ = fVar126;
                auVar170._0_4_ = fVar126;
                auVar170._8_4_ = fVar126;
                auVar170._12_4_ = fVar126;
                auVar171 = vfmadd132ps_fma(auVar170,auVar171,auVar8);
                auVar149._4_4_ = fVar125;
                auVar149._0_4_ = fVar125;
                auVar149._8_4_ = fVar125;
                auVar149._12_4_ = fVar125;
                auVar171 = vfmadd132ps_fma(auVar149,auVar171,*(undefined1 (*) [16])pPVar1);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar103 * 4);
                *(int *)(ray + k * 4 + 0x180) = auVar171._0_4_;
                uVar202 = vextractps_avx(auVar171,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar202;
                uVar202 = vextractps_avx(auVar171,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar202;
                *(float *)(ray + k * 4 + 0x1e0) = fVar146;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar108;
                *(undefined4 *)(ray + k * 4 + 0x220) = uVar4;
                *(undefined4 *)(ray + k * 4 + 0x240) = local_880._4_4_;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                local_880._0_4_ = local_880._4_4_;
                local_880._8_4_ = local_880._4_4_;
                local_880._12_4_ = local_880._4_4_;
                local_880._16_4_ = local_880._4_4_;
                local_880._20_4_ = local_880._4_4_;
                local_880._24_4_ = local_880._4_4_;
                local_880._28_4_ = local_880._4_4_;
                local_700._4_4_ = uVar4;
                local_700._0_4_ = uVar4;
                local_700._8_4_ = uVar4;
                local_700._12_4_ = uVar4;
                local_700._16_4_ = uVar4;
                local_700._20_4_ = uVar4;
                local_700._24_4_ = uVar4;
                local_700._28_4_ = uVar4;
                uVar108 = *(undefined4 *)(ray + k * 4 + 0x100);
                local_7e0 = auVar195;
                local_740 = auVar179;
                local_3bc = iVar101;
                local_3b0 = uVar189;
                uStack_3a8 = uVar98;
                while( true ) {
                  fVar146 = local_340[uVar103];
                  auVar112._4_4_ = fVar146;
                  auVar112._0_4_ = fVar146;
                  auVar112._8_4_ = fVar146;
                  auVar112._12_4_ = fVar146;
                  local_220._16_4_ = fVar146;
                  local_220._0_16_ = auVar112;
                  local_220._20_4_ = fVar146;
                  local_220._24_4_ = fVar146;
                  local_220._28_4_ = fVar146;
                  local_200 = *(undefined4 *)((long)&local_320 + uVar103 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar103 * 4);
                  fVar126 = 1.0 - fVar146;
                  auVar176 = ZEXT416((uint)(fVar146 * fVar126 * 4.0));
                  auVar10 = vfnmsub213ss_fma(auVar112,auVar112,auVar176);
                  auVar176 = vfmadd213ss_fma(ZEXT416((uint)fVar126),ZEXT416((uint)fVar126),auVar176)
                  ;
                  fVar125 = auVar176._0_4_ * 0.5;
                  fVar146 = fVar146 * fVar146 * 0.5;
                  auVar177._0_4_ = fVar146 * fVar124;
                  auVar177._4_4_ = fVar146 * fVar93;
                  auVar177._8_4_ = fVar146 * fVar94;
                  auVar177._12_4_ = fVar146 * fVar95;
                  auVar155._4_4_ = fVar125;
                  auVar155._0_4_ = fVar125;
                  auVar155._8_4_ = fVar125;
                  auVar155._12_4_ = fVar125;
                  auVar176 = vfmadd132ps_fma(auVar155,auVar177,auVar9);
                  fVar146 = auVar10._0_4_ * 0.5;
                  auVar178._4_4_ = fVar146;
                  auVar178._0_4_ = fVar146;
                  auVar178._8_4_ = fVar146;
                  auVar178._12_4_ = fVar146;
                  auVar176 = vfmadd132ps_fma(auVar178,auVar176,auVar8);
                  local_810.context = context->user;
                  fVar146 = fVar126 * -fVar126 * 0.5;
                  auVar156._4_4_ = fVar146;
                  auVar156._0_4_ = fVar146;
                  auVar156._8_4_ = fVar146;
                  auVar156._12_4_ = fVar146;
                  auVar10 = vfmadd132ps_fma(auVar156,auVar176,auVar171);
                  local_280 = auVar10._0_4_;
                  uStack_27c = local_280;
                  uStack_278 = local_280;
                  uStack_274 = local_280;
                  uStack_270 = local_280;
                  uStack_26c = local_280;
                  uStack_268 = local_280;
                  uStack_264 = local_280;
                  auVar176 = vmovshdup_avx(auVar10);
                  local_260 = auVar176._0_8_;
                  uStack_258 = local_260;
                  uStack_250 = local_260;
                  uStack_248 = local_260;
                  auVar176 = vshufps_avx(auVar10,auVar10,0xaa);
                  auVar157._0_8_ = auVar176._0_8_;
                  auVar157._8_8_ = auVar157._0_8_;
                  auVar165._16_8_ = auVar157._0_8_;
                  auVar165._0_16_ = auVar157;
                  auVar165._24_8_ = auVar157._0_8_;
                  local_240 = auVar165;
                  uStack_1fc = local_200;
                  uStack_1f8 = local_200;
                  uStack_1f4 = local_200;
                  uStack_1f0 = local_200;
                  uStack_1ec = local_200;
                  uStack_1e8 = local_200;
                  uStack_1e4 = local_200;
                  local_1e0 = local_700._0_8_;
                  uStack_1d8 = local_700._8_8_;
                  uStack_1d0 = local_700._16_8_;
                  uStack_1c8 = local_700._24_8_;
                  local_1c0 = local_880;
                  auVar120 = vpcmpeqd_avx2(local_880,local_880);
                  local_7a8[1] = auVar120;
                  *local_7a8 = auVar120;
                  local_1a0 = (local_810.context)->instID[0];
                  uStack_19c = local_1a0;
                  uStack_198 = local_1a0;
                  uStack_194 = local_1a0;
                  uStack_190 = local_1a0;
                  uStack_18c = local_1a0;
                  uStack_188 = local_1a0;
                  uStack_184 = local_1a0;
                  local_180 = (local_810.context)->instPrimID[0];
                  uStack_17c = local_180;
                  uStack_178 = local_180;
                  uStack_174 = local_180;
                  uStack_170 = local_180;
                  uStack_16c = local_180;
                  uStack_168 = local_180;
                  uStack_164 = local_180;
                  local_680[0] = local_2e0;
                  local_810.valid = (int *)local_680;
                  local_810.geometryUserPtr = *(void **)(CONCAT44(uStack_63c,local_640) + 0x18);
                  local_810.hit = (RTCHitN *)&local_280;
                  local_810.N = 8;
                  pcVar16 = *(code **)(CONCAT44(uStack_63c,local_640) + 0x40);
                  local_810.ray = (RTCRayN *)ray;
                  if (pcVar16 != (code *)0x0) {
                    auVar165 = ZEXT1632(auVar157);
                    (*pcVar16)(&local_810);
                    auVar216 = ZEXT3264(_local_760);
                    auVar224 = ZEXT3264(local_740);
                    auVar196 = ZEXT3264(local_7e0);
                    auVar212 = ZEXT3264(CONCAT428(fStack_764,
                                                  CONCAT424(fStack_768,
                                                            CONCAT420(fStack_76c,
                                                                      CONCAT416(fStack_770,
                                                                                CONCAT412(fStack_774
                                                                                          ,CONCAT48(
                                                  fStack_778,CONCAT44(fStack_77c,local_780))))))));
                  }
                  auVar187 = vpcmpeqd_avx2(local_680[0],_DAT_01faff00);
                  auVar118 = vpcmpeqd_avx2(auVar165,auVar165);
                  auVar120 = auVar118 & ~auVar187;
                  if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar120 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar120 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar120 >> 0x7f,0) == '\0') &&
                        (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar120 >> 0xbf,0) == '\0') &&
                      (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar120[0x1f]) {
                    auVar187 = auVar187 ^ auVar118;
                  }
                  else {
                    p_Var15 = context->args->filter;
                    if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)(CONCAT44(uStack_63c,local_640) + 0x3e) & 0x40) != 0)))) {
                      auVar118 = ZEXT1632(auVar118._0_16_);
                      (*p_Var15)(&local_810);
                      auVar216 = ZEXT3264(_local_760);
                      auVar224 = ZEXT3264(local_740);
                      auVar196 = ZEXT3264(local_7e0);
                      auVar212 = ZEXT3264(CONCAT428(fStack_764,
                                                    CONCAT424(fStack_768,
                                                              CONCAT420(fStack_76c,
                                                                        CONCAT416(fStack_770,
                                                                                  CONCAT412(
                                                  fStack_774,
                                                  CONCAT48(fStack_778,CONCAT44(fStack_77c,local_780)
                                                          )))))));
                    }
                    auVar137 = vpcmpeqd_avx2(local_680[0],SUB6432(ZEXT1664((undefined1  [16])0x0),0)
                                            );
                    auVar118 = vpcmpeqd_avx2(auVar118,auVar118);
                    auVar187 = auVar137 ^ auVar118;
                    auVar120 = auVar118 & ~auVar137;
                    if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar120 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar120 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar120 >> 0x7f,0) != '\0') ||
                          (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar120 >> 0xbf,0) != '\0') ||
                        (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar120[0x1f] < '\0') {
                      auVar144._0_4_ = auVar137._0_4_ ^ auVar118._0_4_;
                      auVar144._4_4_ = auVar137._4_4_ ^ auVar118._4_4_;
                      auVar144._8_4_ = auVar137._8_4_ ^ auVar118._8_4_;
                      auVar144._12_4_ = auVar137._12_4_ ^ auVar118._12_4_;
                      auVar144._16_4_ = auVar137._16_4_ ^ auVar118._16_4_;
                      auVar144._20_4_ = auVar137._20_4_ ^ auVar118._20_4_;
                      auVar144._24_4_ = auVar137._24_4_ ^ auVar118._24_4_;
                      auVar144._28_4_ = auVar137._28_4_ ^ auVar118._28_4_;
                      auVar120 = vmaskmovps_avx(auVar144,*(undefined1 (*) [32])local_810.hit);
                      *(undefined1 (*) [32])(local_810.ray + 0x180) = auVar120;
                      auVar120 = vmaskmovps_avx(auVar144,*(undefined1 (*) [32])
                                                          (local_810.hit + 0x20));
                      *(undefined1 (*) [32])(local_810.ray + 0x1a0) = auVar120;
                      auVar120 = vmaskmovps_avx(auVar144,*(undefined1 (*) [32])
                                                          (local_810.hit + 0x40));
                      *(undefined1 (*) [32])(local_810.ray + 0x1c0) = auVar120;
                      auVar120 = vmaskmovps_avx(auVar144,*(undefined1 (*) [32])
                                                          (local_810.hit + 0x60));
                      *(undefined1 (*) [32])(local_810.ray + 0x1e0) = auVar120;
                      auVar120 = vmaskmovps_avx(auVar144,*(undefined1 (*) [32])
                                                          (local_810.hit + 0x80));
                      *(undefined1 (*) [32])(local_810.ray + 0x200) = auVar120;
                      auVar120 = vpmaskmovd_avx2(auVar144,*(undefined1 (*) [32])
                                                           (local_810.hit + 0xa0));
                      *(undefined1 (*) [32])(local_810.ray + 0x220) = auVar120;
                      auVar120 = vpmaskmovd_avx2(auVar144,*(undefined1 (*) [32])
                                                           (local_810.hit + 0xc0));
                      *(undefined1 (*) [32])(local_810.ray + 0x240) = auVar120;
                      auVar120 = vpmaskmovd_avx2(auVar144,*(undefined1 (*) [32])
                                                           (local_810.hit + 0xe0));
                      *(undefined1 (*) [32])(local_810.ray + 0x260) = auVar120;
                      auVar120 = vpmaskmovd_avx2(auVar144,*(undefined1 (*) [32])
                                                           (local_810.hit + 0x100));
                      *(undefined1 (*) [32])(local_810.ray + 0x280) = auVar120;
                    }
                  }
                  auVar120 = local_600;
                  auVar195 = auVar196._0_32_;
                  auVar179 = auVar224._0_32_;
                  if ((((((((auVar187 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar187 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar187 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar187 >> 0x7f,0) == '\0') &&
                        (auVar187 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar187 >> 0xbf,0) == '\0') &&
                      (auVar187 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar187[0x1f]) {
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar108;
                  }
                  else {
                    uVar108 = *(undefined4 *)(ray + k * 4 + 0x100);
                  }
                  *(undefined4 *)(local_6a0 + uVar103 * 4) = 0;
                  auVar123._4_4_ = uVar108;
                  auVar123._0_4_ = uVar108;
                  auVar123._8_4_ = uVar108;
                  auVar123._12_4_ = uVar108;
                  auVar123._16_4_ = uVar108;
                  auVar123._20_4_ = uVar108;
                  auVar123._24_4_ = uVar108;
                  auVar123._28_4_ = uVar108;
                  auVar118 = vcmpps_avx(auVar120,auVar123,2);
                  auVar187 = vandps_avx(auVar118,local_6a0);
                  local_6a0 = local_6a0 & auVar118;
                  if ((((((((local_6a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_6a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_6a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_6a0 >> 0x7f,0) == '\0') &&
                        (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_6a0 >> 0xbf,0) == '\0') &&
                      (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_6a0[0x1f]) break;
                  auVar145._8_4_ = 0x7f800000;
                  auVar145._0_8_ = 0x7f8000007f800000;
                  auVar145._12_4_ = 0x7f800000;
                  auVar145._16_4_ = 0x7f800000;
                  auVar145._20_4_ = 0x7f800000;
                  auVar145._24_4_ = 0x7f800000;
                  auVar145._28_4_ = 0x7f800000;
                  auVar120 = vblendvps_avx(auVar145,auVar120,auVar187);
                  auVar118 = vshufps_avx(auVar120,auVar120,0xb1);
                  auVar118 = vminps_avx(auVar120,auVar118);
                  auVar137 = vshufpd_avx(auVar118,auVar118,5);
                  auVar118 = vminps_avx(auVar118,auVar137);
                  auVar137 = vpermpd_avx2(auVar118,0x4e);
                  auVar118 = vminps_avx(auVar118,auVar137);
                  auVar118 = vcmpps_avx(auVar120,auVar118,0);
                  auVar137 = auVar187 & auVar118;
                  auVar120 = auVar187;
                  if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar137 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar137 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar137 >> 0x7f,0) != '\0') ||
                        (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar137 >> 0xbf,0) != '\0') ||
                      (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar137[0x1f] < '\0') {
                    auVar120 = vandps_avx(auVar118,auVar187);
                  }
                  uVar102 = vmovmskps_avx(auVar120);
                  uVar104 = 0;
                  for (; (uVar102 & 1) == 0; uVar102 = uVar102 >> 1 | 0x80000000) {
                    uVar104 = uVar104 + 1;
                  }
                  uVar103 = (ulong)uVar104;
                  local_6a0 = auVar187;
                }
              }
            }
          }
        }
      }
      if (8 < iVar101) {
        _local_760 = auVar216._0_32_;
        local_5e0._4_4_ = iVar101;
        local_5e0._0_4_ = iVar101;
        fStack_5d8 = (float)iVar101;
        fStack_5d4 = (float)iVar101;
        fStack_5d0 = (float)iVar101;
        fStack_5cc = (float)iVar101;
        fStack_5c8 = (float)iVar101;
        iStack_5c4 = iVar101;
        local_4e0._4_4_ = fVar147;
        local_4e0._0_4_ = fVar147;
        fStack_4d8 = fVar147;
        fStack_4d4 = fVar147;
        fStack_4d0 = fVar147;
        fStack_4cc = fVar147;
        fStack_4c8 = fVar147;
        fStack_4c4 = fVar147;
        local_500._4_4_ = local_720._0_4_;
        local_500._0_4_ = local_720._0_4_;
        local_500._8_4_ = local_720._0_4_;
        local_500._12_4_ = local_720._0_4_;
        local_500._16_4_ = local_720._0_4_;
        local_500._20_4_ = local_720._0_4_;
        local_500._24_4_ = local_720._0_4_;
        local_500._28_4_ = local_720._0_4_;
        local_160 = 1.0 / (float)local_5c0._0_4_;
        fStack_15c = local_160;
        fStack_158 = local_160;
        fStack_154 = local_160;
        fStack_150 = local_160;
        fStack_14c = local_160;
        fStack_148 = local_160;
        fStack_144 = local_160;
        local_140 = uVar4;
        uStack_13c = uVar4;
        uStack_138 = uVar4;
        uStack_134 = uVar4;
        uStack_130 = uVar4;
        uStack_12c = uVar4;
        uStack_128 = uVar4;
        uStack_124 = uVar4;
        lVar106 = 8;
        local_7e0 = auVar195;
        local_740 = auVar179;
        local_640 = local_880._4_4_;
        uStack_63c = local_880._4_4_;
        uStack_638 = local_880._4_4_;
        uStack_634 = local_880._4_4_;
        uStack_630 = local_880._4_4_;
        uStack_62c = local_880._4_4_;
        uStack_628 = local_880._4_4_;
        uStack_624 = local_880._4_4_;
        do {
          auVar120 = *(undefined1 (*) [32])(bspline_basis0 + lVar106 * 4 + lVar21);
          auVar187 = *(undefined1 (*) [32])(lVar21 + 0x21aefac + lVar106 * 4);
          auVar118 = *(undefined1 (*) [32])(lVar21 + 0x21af430 + lVar106 * 4);
          pauVar2 = (undefined1 (*) [32])(lVar21 + 0x21af8b4 + lVar106 * 4);
          auVar99 = *(undefined1 (*) [28])*pauVar2;
          auVar224._0_4_ = local_560 * *(float *)*pauVar2;
          auVar224._4_4_ = fStack_55c * *(float *)(*pauVar2 + 4);
          auVar224._8_4_ = fStack_558 * *(float *)(*pauVar2 + 8);
          auVar224._12_4_ = fStack_554 * *(float *)(*pauVar2 + 0xc);
          auVar224._16_4_ = fStack_550 * *(float *)(*pauVar2 + 0x10);
          auVar224._20_4_ = fStack_54c * *(float *)(*pauVar2 + 0x14);
          auVar224._28_36_ = auVar216._28_36_;
          auVar224._24_4_ = fStack_548 * *(float *)(*pauVar2 + 0x18);
          auVar57._4_4_ = auVar212._4_4_ * *(float *)(*pauVar2 + 4);
          auVar57._0_4_ = auVar212._0_4_ * *(float *)*pauVar2;
          auVar57._8_4_ = auVar212._8_4_ * *(float *)(*pauVar2 + 8);
          auVar57._12_4_ = auVar212._12_4_ * *(float *)(*pauVar2 + 0xc);
          auVar57._16_4_ = auVar212._16_4_ * *(float *)(*pauVar2 + 0x10);
          auVar57._20_4_ = auVar212._20_4_ * *(float *)(*pauVar2 + 0x14);
          auVar57._24_4_ = auVar212._24_4_ * *(float *)(*pauVar2 + 0x18);
          auVar57._28_4_ = *(undefined4 *)(*pauVar2 + 0x1c);
          auVar171 = vfmadd231ps_fma(auVar224._0_32_,auVar118,local_7a0);
          auVar176 = vfmadd231ps_fma(auVar57,auVar118,local_6c0);
          auVar171 = vfmadd231ps_fma(ZEXT1632(auVar171),auVar187,auVar222);
          auVar176 = vfmadd231ps_fma(ZEXT1632(auVar176),auVar187,local_5a0);
          auVar171 = vfmadd231ps_fma(ZEXT1632(auVar171),auVar120,auVar204);
          auVar176 = vfmadd231ps_fma(ZEXT1632(auVar176),auVar120,local_580);
          auVar137 = *(undefined1 (*) [32])(bspline_basis1 + lVar106 * 4 + lVar21);
          auVar214 = *(undefined1 (*) [32])(lVar21 + 0x21b13cc + lVar106 * 4);
          auVar19 = *(undefined1 (*) [32])(lVar21 + 0x21b1850 + lVar106 * 4);
          pfVar3 = (float *)(lVar21 + 0x21b1cd4 + lVar106 * 4);
          fVar130 = *pfVar3;
          fVar197 = pfVar3[1];
          fVar206 = pfVar3[2];
          fVar207 = pfVar3[3];
          fVar208 = pfVar3[4];
          fVar96 = pfVar3[5];
          fVar97 = pfVar3[6];
          auVar196._0_4_ = local_560 * fVar130;
          auVar196._4_4_ = fStack_55c * fVar197;
          auVar196._8_4_ = fStack_558 * fVar206;
          auVar196._12_4_ = fStack_554 * fVar207;
          auVar196._16_4_ = fStack_550 * fVar208;
          auVar196._20_4_ = fStack_54c * fVar96;
          auVar196._28_36_ = auVar212._28_36_;
          auVar196._24_4_ = fStack_548 * fVar97;
          auVar58._4_4_ = auVar212._4_4_ * fVar197;
          auVar58._0_4_ = auVar212._0_4_ * fVar130;
          auVar58._8_4_ = auVar212._8_4_ * fVar206;
          auVar58._12_4_ = auVar212._12_4_ * fVar207;
          auVar58._16_4_ = auVar212._16_4_ * fVar208;
          auVar58._20_4_ = auVar212._20_4_ * fVar96;
          auVar58._24_4_ = auVar212._24_4_ * fVar97;
          auVar58._28_4_ = fStack_544;
          auVar10 = vfmadd231ps_fma(auVar196._0_32_,auVar19,local_7a0);
          auVar11 = vfmadd231ps_fma(auVar58,auVar19,local_6c0);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar214,auVar222);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar214,local_5a0);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar137,auVar204);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar137,local_580);
          local_460 = ZEXT1632(auVar10);
          local_4c0 = ZEXT1632(auVar171);
          auVar20 = vsubps_avx(local_460,local_4c0);
          local_700 = ZEXT1632(auVar11);
          local_480 = ZEXT1632(auVar176);
          local_4a0 = vsubps_avx(local_700,local_480);
          auVar90._4_4_ = auVar20._4_4_ * auVar176._4_4_;
          auVar90._0_4_ = auVar20._0_4_ * auVar176._0_4_;
          auVar90._8_4_ = auVar20._8_4_ * auVar176._8_4_;
          auVar90._12_4_ = auVar20._12_4_ * auVar176._12_4_;
          auVar90._16_4_ = auVar20._16_4_ * 0.0;
          auVar90._20_4_ = auVar20._20_4_ * 0.0;
          auVar90._24_4_ = auVar20._24_4_ * 0.0;
          auVar90._28_4_ = local_5a0._28_4_;
          fVar147 = local_4a0._0_4_;
          fVar146 = local_4a0._4_4_;
          auVar89._4_4_ = auVar171._4_4_ * fVar146;
          auVar89._0_4_ = auVar171._0_4_ * fVar147;
          fVar125 = local_4a0._8_4_;
          auVar89._8_4_ = auVar171._8_4_ * fVar125;
          fVar126 = local_4a0._12_4_;
          auVar89._12_4_ = auVar171._12_4_ * fVar126;
          fVar127 = local_4a0._16_4_;
          auVar89._16_4_ = fVar127 * 0.0;
          fVar128 = local_4a0._20_4_;
          auVar89._20_4_ = fVar128 * 0.0;
          fVar129 = local_4a0._24_4_;
          auVar89._24_4_ = fVar129 * 0.0;
          auVar89._28_4_ = local_7a0._28_4_;
          auVar216 = ZEXT3264(*pauVar2);
          auVar162 = vsubps_avx(auVar90,auVar89);
          auVar59._4_4_ = auVar99._4_4_ * local_100._4_4_;
          auVar59._0_4_ = auVar99._0_4_ * (float)local_100;
          auVar59._8_4_ = auVar99._8_4_ * (float)uStack_f8;
          auVar59._12_4_ = auVar99._12_4_ * uStack_f8._4_4_;
          auVar59._16_4_ = auVar99._16_4_ * (float)uStack_f0;
          auVar59._20_4_ = auVar99._20_4_ * uStack_f0._4_4_;
          auVar59._24_4_ = auVar99._24_4_ * (float)uStack_e8;
          auVar59._28_4_ = local_5a0._28_4_;
          auVar171 = vfmadd231ps_fma(auVar59,auVar118,local_e0);
          auVar171 = vfmadd231ps_fma(ZEXT1632(auVar171),auVar187,local_c0);
          auVar171 = vfmadd231ps_fma(ZEXT1632(auVar171),local_a0,auVar120);
          auVar60._4_4_ = local_100._4_4_ * fVar197;
          auVar60._0_4_ = (float)local_100 * fVar130;
          auVar60._8_4_ = (float)uStack_f8 * fVar206;
          auVar60._12_4_ = uStack_f8._4_4_ * fVar207;
          auVar60._16_4_ = (float)uStack_f0 * fVar208;
          auVar60._20_4_ = uStack_f0._4_4_ * fVar96;
          auVar60._24_4_ = (float)uStack_e8 * fVar97;
          auVar60._28_4_ = uStack_e8._4_4_;
          auVar176 = vfmadd231ps_fma(auVar60,auVar19,local_e0);
          auVar176 = vfmadd231ps_fma(ZEXT1632(auVar176),auVar214,local_c0);
          auVar176 = vfmadd231ps_fma(ZEXT1632(auVar176),auVar137,local_a0);
          auVar61._4_4_ = fVar146 * fVar146;
          auVar61._0_4_ = fVar147 * fVar147;
          auVar61._8_4_ = fVar125 * fVar125;
          auVar61._12_4_ = fVar126 * fVar126;
          auVar61._16_4_ = fVar127 * fVar127;
          auVar61._20_4_ = fVar128 * fVar128;
          auVar61._24_4_ = fVar129 * fVar129;
          auVar61._28_4_ = local_4a0._28_4_;
          auVar10 = vfmadd231ps_fma(auVar61,auVar20,auVar20);
          auVar198 = vmaxps_avx(ZEXT1632(auVar171),ZEXT1632(auVar176));
          auVar200._0_4_ = auVar198._0_4_ * auVar198._0_4_ * auVar10._0_4_;
          auVar200._4_4_ = auVar198._4_4_ * auVar198._4_4_ * auVar10._4_4_;
          auVar200._8_4_ = auVar198._8_4_ * auVar198._8_4_ * auVar10._8_4_;
          auVar200._12_4_ = auVar198._12_4_ * auVar198._12_4_ * auVar10._12_4_;
          auVar200._16_4_ = auVar198._16_4_ * auVar198._16_4_ * 0.0;
          auVar200._20_4_ = auVar198._20_4_ * auVar198._20_4_ * 0.0;
          auVar200._24_4_ = auVar198._24_4_ * auVar198._24_4_ * 0.0;
          auVar200._28_4_ = 0;
          auVar62._4_4_ = auVar162._4_4_ * auVar162._4_4_;
          auVar62._0_4_ = auVar162._0_4_ * auVar162._0_4_;
          auVar62._8_4_ = auVar162._8_4_ * auVar162._8_4_;
          auVar62._12_4_ = auVar162._12_4_ * auVar162._12_4_;
          auVar62._16_4_ = auVar162._16_4_ * auVar162._16_4_;
          auVar62._20_4_ = auVar162._20_4_ * auVar162._20_4_;
          auVar62._24_4_ = auVar162._24_4_ * auVar162._24_4_;
          auVar62._28_4_ = auVar162._28_4_;
          auVar198 = vcmpps_avx(auVar62,auVar200,2);
          local_3c0 = (int)lVar106;
          auVar201._4_4_ = local_3c0;
          auVar201._0_4_ = local_3c0;
          auVar201._8_4_ = local_3c0;
          auVar201._12_4_ = local_3c0;
          auVar201._16_4_ = local_3c0;
          auVar201._20_4_ = local_3c0;
          auVar201._24_4_ = local_3c0;
          auVar201._28_4_ = local_3c0;
          auVar162 = vpor_avx2(auVar201,_DAT_01fe9900);
          auVar18 = vpcmpgtd_avx2(_local_5e0,auVar162);
          auVar162 = auVar18 & auVar198;
          if ((((((((auVar162 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar162 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar162 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar162 >> 0x7f,0) == '\0') &&
                (auVar162 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar162 >> 0xbf,0) == '\0') &&
              (auVar162 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar162[0x1f]) {
            auVar212 = ZEXT3264(CONCAT428(fStack_764,
                                          CONCAT424(fStack_768,
                                                    CONCAT420(fStack_76c,
                                                              CONCAT416(fStack_770,
                                                                        CONCAT412(fStack_774,
                                                                                  CONCAT48(
                                                  fStack_778,CONCAT44(fStack_77c,local_780))))))));
          }
          else {
            local_5c0 = vandps_avx(auVar18,auVar198);
            auVar63._4_4_ = (float)local_760._4_4_ * fVar197;
            auVar63._0_4_ = (float)local_760._0_4_ * fVar130;
            auVar63._8_4_ = fStack_758 * fVar206;
            auVar63._12_4_ = fStack_754 * fVar207;
            auVar63._16_4_ = fStack_750 * fVar208;
            auVar63._20_4_ = fStack_74c * fVar96;
            auVar63._24_4_ = fStack_748 * fVar97;
            auVar63._28_4_ = auVar198._28_4_;
            auVar10 = vfmadd213ps_fma(auVar19,local_740,auVar63);
            auVar10 = vfmadd213ps_fma(auVar214,local_7e0,ZEXT1632(auVar10));
            auVar10 = vfmadd132ps_fma(auVar137,ZEXT1632(auVar10),local_6e0);
            auVar64._4_4_ = auVar99._4_4_ * (float)local_760._4_4_;
            auVar64._0_4_ = auVar99._0_4_ * (float)local_760._0_4_;
            auVar64._8_4_ = auVar99._8_4_ * fStack_758;
            auVar64._12_4_ = auVar99._12_4_ * fStack_754;
            auVar64._16_4_ = auVar99._16_4_ * fStack_750;
            auVar64._20_4_ = auVar99._20_4_ * fStack_74c;
            auVar64._24_4_ = auVar99._24_4_ * fStack_748;
            auVar64._28_4_ = auVar198._28_4_;
            auVar11 = vfmadd213ps_fma(auVar118,local_740,auVar64);
            auVar11 = vfmadd213ps_fma(auVar187,local_7e0,ZEXT1632(auVar11));
            auVar187 = *(undefined1 (*) [32])(lVar21 + 0x21afd38 + lVar106 * 4);
            auVar118 = *(undefined1 (*) [32])(lVar21 + 0x21b01bc + lVar106 * 4);
            auVar137 = *(undefined1 (*) [32])(lVar21 + 0x21b0640 + lVar106 * 4);
            pfVar3 = (float *)(lVar21 + 0x21b0ac4 + lVar106 * 4);
            fVar147 = *pfVar3;
            fVar146 = pfVar3[1];
            fVar125 = pfVar3[2];
            fVar126 = pfVar3[3];
            fVar127 = pfVar3[4];
            fVar128 = pfVar3[5];
            fVar129 = pfVar3[6];
            auVar65._4_4_ = fStack_55c * fVar146;
            auVar65._0_4_ = local_560 * fVar147;
            auVar65._8_4_ = fStack_558 * fVar125;
            auVar65._12_4_ = fStack_554 * fVar126;
            auVar65._16_4_ = fStack_550 * fVar127;
            auVar65._20_4_ = fStack_54c * fVar128;
            auVar65._24_4_ = fStack_548 * fVar129;
            auVar65._28_4_ = auVar20._28_4_;
            auVar66._4_4_ = fStack_77c * fVar146;
            auVar66._0_4_ = local_780 * fVar147;
            auVar66._8_4_ = fStack_778 * fVar125;
            auVar66._12_4_ = fStack_774 * fVar126;
            auVar66._16_4_ = fStack_770 * fVar127;
            auVar66._20_4_ = fStack_76c * fVar128;
            auVar66._24_4_ = fStack_768 * fVar129;
            auVar66._28_4_ = *(undefined4 *)(*pauVar2 + 0x1c);
            auVar67._4_4_ = fVar146 * (float)local_760._4_4_;
            auVar67._0_4_ = fVar147 * (float)local_760._0_4_;
            auVar67._8_4_ = fVar125 * fStack_758;
            auVar67._12_4_ = fVar126 * fStack_754;
            auVar67._16_4_ = fVar127 * fStack_750;
            auVar67._20_4_ = fVar128 * fStack_74c;
            auVar67._24_4_ = fVar129 * fStack_748;
            auVar67._28_4_ = pfVar3[7];
            auVar12 = vfmadd231ps_fma(auVar65,auVar137,local_7a0);
            auVar110 = vfmadd231ps_fma(auVar66,auVar137,local_6c0);
            auVar190 = vfmadd231ps_fma(auVar67,local_740,auVar137);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar118,auVar222);
            auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar118,local_5a0);
            auVar190 = vfmadd231ps_fma(ZEXT1632(auVar190),local_7e0,auVar118);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar187,auVar204);
            auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar187,local_580);
            auVar190 = vfmadd231ps_fma(ZEXT1632(auVar190),auVar187,local_6e0);
            pfVar3 = (float *)(lVar21 + 0x21b2ee4 + lVar106 * 4);
            fVar147 = *pfVar3;
            fVar146 = pfVar3[1];
            fVar125 = pfVar3[2];
            fVar126 = pfVar3[3];
            fVar127 = pfVar3[4];
            fVar128 = pfVar3[5];
            fVar129 = pfVar3[6];
            auVar68._4_4_ = fStack_55c * fVar146;
            auVar68._0_4_ = local_560 * fVar147;
            auVar68._8_4_ = fStack_558 * fVar125;
            auVar68._12_4_ = fStack_554 * fVar126;
            auVar68._16_4_ = fStack_550 * fVar127;
            auVar68._20_4_ = fStack_54c * fVar128;
            auVar68._24_4_ = fStack_548 * fVar129;
            auVar68._28_4_ = fStack_544;
            auVar69._4_4_ = fStack_77c * fVar146;
            auVar69._0_4_ = local_780 * fVar147;
            auVar69._8_4_ = fStack_778 * fVar125;
            auVar69._12_4_ = fStack_774 * fVar126;
            auVar69._16_4_ = fStack_770 * fVar127;
            auVar69._20_4_ = fStack_76c * fVar128;
            auVar69._24_4_ = fStack_768 * fVar129;
            auVar69._28_4_ = local_7e0._28_4_;
            auVar70._4_4_ = fVar146 * (float)local_760._4_4_;
            auVar70._0_4_ = fVar147 * (float)local_760._0_4_;
            auVar70._8_4_ = fVar125 * fStack_758;
            auVar70._12_4_ = fVar126 * fStack_754;
            auVar70._16_4_ = fVar127 * fStack_750;
            auVar70._20_4_ = fVar128 * fStack_74c;
            auVar70._24_4_ = fVar129 * fStack_748;
            auVar70._28_4_ = pfVar3[7];
            auVar187 = *(undefined1 (*) [32])(lVar21 + 0x21b2a60 + lVar106 * 4);
            auVar168 = vfmadd231ps_fma(auVar68,auVar187,local_7a0);
            auVar185 = vfmadd231ps_fma(auVar69,auVar187,local_6c0);
            auVar186 = vfmadd231ps_fma(auVar70,auVar187,local_740);
            auVar187 = *(undefined1 (*) [32])(lVar21 + 0x21b25dc + lVar106 * 4);
            auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar187,auVar222);
            auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),auVar187,local_5a0);
            auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar187,local_7e0);
            auVar187 = *(undefined1 (*) [32])(lVar21 + 0x21b2158 + lVar106 * 4);
            auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar187,auVar204);
            auVar185 = vfmadd231ps_fma(ZEXT1632(auVar185),auVar187,local_580);
            auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),local_6e0,auVar187);
            auVar187 = vandps_avx(ZEXT1632(auVar12),local_2c0);
            auVar118 = vandps_avx(ZEXT1632(auVar110),local_2c0);
            auVar118 = vmaxps_avx(auVar187,auVar118);
            auVar187 = vandps_avx(ZEXT1632(auVar190),local_2c0);
            auVar187 = vmaxps_avx(auVar118,auVar187);
            auVar187 = vcmpps_avx(auVar187,_local_4e0,1);
            auVar137 = vblendvps_avx(ZEXT1632(auVar12),auVar20,auVar187);
            auVar214 = vblendvps_avx(ZEXT1632(auVar110),local_4a0,auVar187);
            auVar187 = vandps_avx(ZEXT1632(auVar168),local_2c0);
            auVar118 = vandps_avx(ZEXT1632(auVar185),local_2c0);
            auVar118 = vmaxps_avx(auVar187,auVar118);
            auVar187 = vandps_avx(local_2c0,ZEXT1632(auVar186));
            auVar187 = vmaxps_avx(auVar118,auVar187);
            auVar118 = vcmpps_avx(auVar187,_local_4e0,1);
            auVar187 = vblendvps_avx(ZEXT1632(auVar168),auVar20,auVar118);
            auVar118 = vblendvps_avx(ZEXT1632(auVar185),local_4a0,auVar118);
            auVar11 = vfmadd213ps_fma(auVar120,local_6e0,ZEXT1632(auVar11));
            auVar12 = vfmadd213ps_fma(auVar137,auVar137,ZEXT832(0) << 0x20);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar214,auVar214);
            auVar120 = vrsqrtps_avx(ZEXT1632(auVar12));
            fVar147 = auVar120._0_4_;
            fVar146 = auVar120._4_4_;
            fVar125 = auVar120._8_4_;
            fVar126 = auVar120._12_4_;
            fVar127 = auVar120._16_4_;
            fVar128 = auVar120._20_4_;
            fVar129 = auVar120._24_4_;
            auVar71._4_4_ = fVar146 * fVar146 * fVar146 * auVar12._4_4_ * -0.5;
            auVar71._0_4_ = fVar147 * fVar147 * fVar147 * auVar12._0_4_ * -0.5;
            auVar71._8_4_ = fVar125 * fVar125 * fVar125 * auVar12._8_4_ * -0.5;
            auVar71._12_4_ = fVar126 * fVar126 * fVar126 * auVar12._12_4_ * -0.5;
            auVar71._16_4_ = fVar127 * fVar127 * fVar127 * -0.0;
            auVar71._20_4_ = fVar128 * fVar128 * fVar128 * -0.0;
            auVar71._24_4_ = fVar129 * fVar129 * fVar129 * -0.0;
            auVar71._28_4_ = 0;
            auVar223._8_4_ = 0x3fc00000;
            auVar223._0_8_ = 0x3fc000003fc00000;
            auVar223._12_4_ = 0x3fc00000;
            auVar223._16_4_ = 0x3fc00000;
            auVar223._20_4_ = 0x3fc00000;
            auVar223._24_4_ = 0x3fc00000;
            auVar223._28_4_ = 0x3fc00000;
            auVar12 = vfmadd231ps_fma(auVar71,auVar223,auVar120);
            fVar147 = auVar12._0_4_;
            fVar146 = auVar12._4_4_;
            auVar72._4_4_ = auVar214._4_4_ * fVar146;
            auVar72._0_4_ = auVar214._0_4_ * fVar147;
            fVar125 = auVar12._8_4_;
            auVar72._8_4_ = auVar214._8_4_ * fVar125;
            fVar126 = auVar12._12_4_;
            auVar72._12_4_ = auVar214._12_4_ * fVar126;
            auVar72._16_4_ = auVar214._16_4_ * 0.0;
            auVar72._20_4_ = auVar214._20_4_ * 0.0;
            auVar72._24_4_ = auVar214._24_4_ * 0.0;
            auVar72._28_4_ = auVar214._28_4_;
            auVar73._4_4_ = fVar146 * -auVar137._4_4_;
            auVar73._0_4_ = fVar147 * -auVar137._0_4_;
            auVar73._8_4_ = fVar125 * -auVar137._8_4_;
            auVar73._12_4_ = fVar126 * -auVar137._12_4_;
            auVar73._16_4_ = -auVar137._16_4_ * 0.0;
            auVar73._20_4_ = -auVar137._20_4_ * 0.0;
            auVar73._24_4_ = -auVar137._24_4_ * 0.0;
            auVar73._28_4_ = auVar120._28_4_;
            auVar12 = vfmadd213ps_fma(auVar187,auVar187,ZEXT832(0) << 0x20);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar118,auVar118);
            auVar120 = vrsqrtps_avx(ZEXT1632(auVar12));
            auVar74._28_4_ = local_580._28_4_;
            auVar74._0_28_ =
                 ZEXT1628(CONCAT412(fVar126 * 0.0,
                                    CONCAT48(fVar125 * 0.0,CONCAT44(fVar146 * 0.0,fVar147 * 0.0))));
            fVar147 = auVar120._0_4_;
            fVar146 = auVar120._4_4_;
            fVar125 = auVar120._8_4_;
            fVar126 = auVar120._12_4_;
            fVar127 = auVar120._16_4_;
            fVar128 = auVar120._20_4_;
            fVar129 = auVar120._24_4_;
            auVar75._4_4_ = fVar146 * fVar146 * fVar146 * auVar12._4_4_ * -0.5;
            auVar75._0_4_ = fVar147 * fVar147 * fVar147 * auVar12._0_4_ * -0.5;
            auVar75._8_4_ = fVar125 * fVar125 * fVar125 * auVar12._8_4_ * -0.5;
            auVar75._12_4_ = fVar126 * fVar126 * fVar126 * auVar12._12_4_ * -0.5;
            auVar75._16_4_ = fVar127 * fVar127 * fVar127 * -0.0;
            auVar75._20_4_ = fVar128 * fVar128 * fVar128 * -0.0;
            auVar75._24_4_ = fVar129 * fVar129 * fVar129 * -0.0;
            auVar75._28_4_ = 0;
            auVar12 = vfmadd231ps_fma(auVar75,auVar223,auVar120);
            fVar147 = auVar12._0_4_;
            auVar219._0_4_ = auVar118._0_4_ * fVar147;
            fVar146 = auVar12._4_4_;
            auVar219._4_4_ = auVar118._4_4_ * fVar146;
            fVar125 = auVar12._8_4_;
            auVar219._8_4_ = auVar118._8_4_ * fVar125;
            fVar126 = auVar12._12_4_;
            auVar219._12_4_ = auVar118._12_4_ * fVar126;
            auVar219._16_4_ = auVar118._16_4_ * 0.0;
            auVar219._20_4_ = auVar118._20_4_ * 0.0;
            auVar219._24_4_ = auVar118._24_4_ * 0.0;
            auVar219._28_4_ = 0;
            auVar76._4_4_ = fVar146 * -auVar187._4_4_;
            auVar76._0_4_ = fVar147 * -auVar187._0_4_;
            auVar76._8_4_ = fVar125 * -auVar187._8_4_;
            auVar76._12_4_ = fVar126 * -auVar187._12_4_;
            auVar76._16_4_ = -auVar187._16_4_ * 0.0;
            auVar76._20_4_ = -auVar187._20_4_ * 0.0;
            auVar76._24_4_ = -auVar187._24_4_ * 0.0;
            auVar76._28_4_ = auVar120._28_4_;
            auVar77._28_4_ = 0xbf000000;
            auVar77._0_28_ =
                 ZEXT1628(CONCAT412(fVar126 * 0.0,
                                    CONCAT48(fVar125 * 0.0,CONCAT44(fVar146 * 0.0,fVar147 * 0.0))));
            auVar12 = vfmadd213ps_fma(auVar72,ZEXT1632(auVar171),local_4c0);
            auVar120 = ZEXT1632(auVar171);
            auVar110 = vfmadd213ps_fma(auVar73,auVar120,local_480);
            auVar190 = vfmadd213ps_fma(auVar74,auVar120,ZEXT1632(auVar11));
            auVar186 = vfnmadd213ps_fma(auVar72,auVar120,local_4c0);
            auVar168 = vfmadd213ps_fma(auVar219,ZEXT1632(auVar176),local_460);
            auVar191 = vfnmadd213ps_fma(auVar73,auVar120,local_480);
            auVar120 = ZEXT1632(auVar176);
            auVar185 = vfmadd213ps_fma(auVar76,auVar120,local_700);
            auVar121 = ZEXT1632(auVar171);
            auVar171 = vfnmadd231ps_fma(ZEXT1632(auVar11),auVar121,auVar74);
            auVar11 = vfmadd213ps_fma(auVar77,auVar120,ZEXT1632(auVar10));
            auVar23 = vfnmadd213ps_fma(auVar219,auVar120,local_460);
            auVar192 = vfnmadd213ps_fma(auVar76,auVar120,local_700);
            auVar10 = vfnmadd231ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar176),auVar77);
            local_720 = ZEXT1632(auVar10);
            auVar120 = vsubps_avx(ZEXT1632(auVar185),ZEXT1632(auVar191));
            auVar187 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar171));
            auVar78._4_4_ = auVar120._4_4_ * auVar171._4_4_;
            auVar78._0_4_ = auVar120._0_4_ * auVar171._0_4_;
            auVar78._8_4_ = auVar120._8_4_ * auVar171._8_4_;
            auVar78._12_4_ = auVar120._12_4_ * auVar171._12_4_;
            auVar78._16_4_ = auVar120._16_4_ * 0.0;
            auVar78._20_4_ = auVar120._20_4_ * 0.0;
            auVar78._24_4_ = auVar120._24_4_ * 0.0;
            auVar78._28_4_ = 0;
            auVar10 = vfmsub231ps_fma(auVar78,ZEXT1632(auVar191),auVar187);
            auVar79._4_4_ = auVar186._4_4_ * auVar187._4_4_;
            auVar79._0_4_ = auVar186._0_4_ * auVar187._0_4_;
            auVar79._8_4_ = auVar186._8_4_ * auVar187._8_4_;
            auVar79._12_4_ = auVar186._12_4_ * auVar187._12_4_;
            auVar79._16_4_ = auVar187._16_4_ * 0.0;
            auVar79._20_4_ = auVar187._20_4_ * 0.0;
            auVar79._24_4_ = auVar187._24_4_ * 0.0;
            auVar79._28_4_ = auVar187._28_4_;
            auVar198 = ZEXT1632(auVar186);
            auVar187 = vsubps_avx(ZEXT1632(auVar168),auVar198);
            auVar162 = ZEXT1632(auVar171);
            auVar171 = vfmsub231ps_fma(auVar79,auVar162,auVar187);
            auVar80._4_4_ = auVar191._4_4_ * auVar187._4_4_;
            auVar80._0_4_ = auVar191._0_4_ * auVar187._0_4_;
            auVar80._8_4_ = auVar191._8_4_ * auVar187._8_4_;
            auVar80._12_4_ = auVar191._12_4_ * auVar187._12_4_;
            auVar80._16_4_ = auVar187._16_4_ * 0.0;
            auVar80._20_4_ = auVar187._20_4_ * 0.0;
            auVar80._24_4_ = auVar187._24_4_ * 0.0;
            auVar80._28_4_ = auVar187._28_4_;
            auVar186 = vfmsub231ps_fma(auVar80,auVar198,auVar120);
            auVar120 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar171 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar120,ZEXT1632(auVar171));
            auVar171 = vfmadd231ps_fma(ZEXT1632(auVar171),auVar120,ZEXT1632(auVar10));
            auVar18 = vcmpps_avx(ZEXT1632(auVar171),ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar120 = vblendvps_avx(ZEXT1632(auVar23),ZEXT1632(auVar12),auVar18);
            auVar187 = vblendvps_avx(ZEXT1632(auVar192),ZEXT1632(auVar110),auVar18);
            auVar118 = vblendvps_avx(local_720,ZEXT1632(auVar190),auVar18);
            auVar137 = vblendvps_avx(auVar198,ZEXT1632(auVar168),auVar18);
            auVar214 = vblendvps_avx(ZEXT1632(auVar191),ZEXT1632(auVar185),auVar18);
            auVar19 = vblendvps_avx(auVar162,ZEXT1632(auVar11),auVar18);
            auVar198 = vblendvps_avx(ZEXT1632(auVar168),auVar198,auVar18);
            auVar20 = vblendvps_avx(ZEXT1632(auVar185),ZEXT1632(auVar191),auVar18);
            auVar171 = vpackssdw_avx(local_5c0._0_16_,local_5c0._16_16_);
            auVar162 = vblendvps_avx(ZEXT1632(auVar11),auVar162,auVar18);
            auVar198 = vsubps_avx(auVar198,auVar120);
            auVar20 = vsubps_avx(auVar20,auVar187);
            auVar227 = vsubps_avx(auVar162,auVar118);
            auVar132 = vsubps_avx(auVar120,auVar137);
            auVar158 = vsubps_avx(auVar187,auVar214);
            auVar159 = vsubps_avx(auVar118,auVar19);
            auVar182._0_4_ = auVar227._0_4_ * auVar120._0_4_;
            auVar182._4_4_ = auVar227._4_4_ * auVar120._4_4_;
            auVar182._8_4_ = auVar227._8_4_ * auVar120._8_4_;
            auVar182._12_4_ = auVar227._12_4_ * auVar120._12_4_;
            auVar182._16_4_ = auVar227._16_4_ * auVar120._16_4_;
            auVar182._20_4_ = auVar227._20_4_ * auVar120._20_4_;
            auVar182._24_4_ = auVar227._24_4_ * auVar120._24_4_;
            auVar182._28_4_ = 0;
            auVar10 = vfmsub231ps_fma(auVar182,auVar118,auVar198);
            auVar81._4_4_ = auVar198._4_4_ * auVar187._4_4_;
            auVar81._0_4_ = auVar198._0_4_ * auVar187._0_4_;
            auVar81._8_4_ = auVar198._8_4_ * auVar187._8_4_;
            auVar81._12_4_ = auVar198._12_4_ * auVar187._12_4_;
            auVar81._16_4_ = auVar198._16_4_ * auVar187._16_4_;
            auVar81._20_4_ = auVar198._20_4_ * auVar187._20_4_;
            auVar81._24_4_ = auVar198._24_4_ * auVar187._24_4_;
            auVar81._28_4_ = auVar162._28_4_;
            auVar11 = vfmsub231ps_fma(auVar81,auVar120,auVar20);
            auVar216 = ZEXT864(0) << 0x20;
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
            auVar183._0_4_ = auVar118._0_4_ * auVar20._0_4_;
            auVar183._4_4_ = auVar118._4_4_ * auVar20._4_4_;
            auVar183._8_4_ = auVar118._8_4_ * auVar20._8_4_;
            auVar183._12_4_ = auVar118._12_4_ * auVar20._12_4_;
            auVar183._16_4_ = auVar118._16_4_ * auVar20._16_4_;
            auVar183._20_4_ = auVar118._20_4_ * auVar20._20_4_;
            auVar183._24_4_ = auVar118._24_4_ * auVar20._24_4_;
            auVar183._28_4_ = 0;
            auVar11 = vfmsub231ps_fma(auVar183,auVar187,auVar227);
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
            auVar184._0_4_ = auVar159._0_4_ * auVar137._0_4_;
            auVar184._4_4_ = auVar159._4_4_ * auVar137._4_4_;
            auVar184._8_4_ = auVar159._8_4_ * auVar137._8_4_;
            auVar184._12_4_ = auVar159._12_4_ * auVar137._12_4_;
            auVar184._16_4_ = auVar159._16_4_ * auVar137._16_4_;
            auVar184._20_4_ = auVar159._20_4_ * auVar137._20_4_;
            auVar184._24_4_ = auVar159._24_4_ * auVar137._24_4_;
            auVar184._28_4_ = 0;
            auVar10 = vfmsub231ps_fma(auVar184,auVar132,auVar19);
            auVar82._4_4_ = auVar158._4_4_ * auVar19._4_4_;
            auVar82._0_4_ = auVar158._0_4_ * auVar19._0_4_;
            auVar82._8_4_ = auVar158._8_4_ * auVar19._8_4_;
            auVar82._12_4_ = auVar158._12_4_ * auVar19._12_4_;
            auVar82._16_4_ = auVar158._16_4_ * auVar19._16_4_;
            auVar82._20_4_ = auVar158._20_4_ * auVar19._20_4_;
            auVar82._24_4_ = auVar158._24_4_ * auVar19._24_4_;
            auVar82._28_4_ = auVar19._28_4_;
            auVar12 = vfmsub231ps_fma(auVar82,auVar214,auVar159);
            auVar83._4_4_ = auVar132._4_4_ * auVar214._4_4_;
            auVar83._0_4_ = auVar132._0_4_ * auVar214._0_4_;
            auVar83._8_4_ = auVar132._8_4_ * auVar214._8_4_;
            auVar83._12_4_ = auVar132._12_4_ * auVar214._12_4_;
            auVar83._16_4_ = auVar132._16_4_ * auVar214._16_4_;
            auVar83._20_4_ = auVar132._20_4_ * auVar214._20_4_;
            auVar83._24_4_ = auVar132._24_4_ * auVar214._24_4_;
            auVar83._28_4_ = auVar214._28_4_;
            auVar110 = vfmsub231ps_fma(auVar83,auVar158,auVar137);
            auVar10 = vfmadd231ps_fma(ZEXT1632(auVar110),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT832(0) << 0x20,ZEXT1632(auVar12));
            auVar137 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar12));
            auVar137 = vcmpps_avx(auVar137,ZEXT832(0) << 0x20,2);
            auVar10 = vpackssdw_avx(auVar137._0_16_,auVar137._16_16_);
            auVar171 = vpand_avx(auVar10,auVar171);
            auVar137 = vpmovsxwd_avx2(auVar171);
            if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar137 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar137 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar137 >> 0x7f,0) == '\0') &&
                  (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar137 >> 0xbf,0) == '\0') &&
                (auVar137 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar137[0x1f]) {
LAB_017a1206:
              auVar167._8_8_ = local_680[1]._8_8_;
              auVar167._0_8_ = local_680[1]._0_8_;
              auVar167._16_8_ = local_680[1]._16_8_;
              auVar167._24_8_ = local_680[1]._24_8_;
            }
            else {
              auVar84._4_4_ = auVar159._4_4_ * auVar20._4_4_;
              auVar84._0_4_ = auVar159._0_4_ * auVar20._0_4_;
              auVar84._8_4_ = auVar159._8_4_ * auVar20._8_4_;
              auVar84._12_4_ = auVar159._12_4_ * auVar20._12_4_;
              auVar84._16_4_ = auVar159._16_4_ * auVar20._16_4_;
              auVar84._20_4_ = auVar159._20_4_ * auVar20._20_4_;
              auVar84._24_4_ = auVar159._24_4_ * auVar20._24_4_;
              auVar84._28_4_ = auVar137._28_4_;
              auVar168 = vfmsub231ps_fma(auVar84,auVar158,auVar227);
              auVar188._0_4_ = auVar227._0_4_ * auVar132._0_4_;
              auVar188._4_4_ = auVar227._4_4_ * auVar132._4_4_;
              auVar188._8_4_ = auVar227._8_4_ * auVar132._8_4_;
              auVar188._12_4_ = auVar227._12_4_ * auVar132._12_4_;
              auVar188._16_4_ = auVar227._16_4_ * auVar132._16_4_;
              auVar188._20_4_ = auVar227._20_4_ * auVar132._20_4_;
              auVar188._24_4_ = auVar227._24_4_ * auVar132._24_4_;
              auVar188._28_4_ = 0;
              auVar190 = vfmsub231ps_fma(auVar188,auVar198,auVar159);
              auVar85._4_4_ = auVar198._4_4_ * auVar158._4_4_;
              auVar85._0_4_ = auVar198._0_4_ * auVar158._0_4_;
              auVar85._8_4_ = auVar198._8_4_ * auVar158._8_4_;
              auVar85._12_4_ = auVar198._12_4_ * auVar158._12_4_;
              auVar85._16_4_ = auVar198._16_4_ * auVar158._16_4_;
              auVar85._20_4_ = auVar198._20_4_ * auVar158._20_4_;
              auVar85._24_4_ = auVar198._24_4_ * auVar158._24_4_;
              auVar85._28_4_ = auVar158._28_4_;
              auVar185 = vfmsub231ps_fma(auVar85,auVar132,auVar20);
              auVar10 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar190),ZEXT1632(auVar185));
              auVar110 = vfmadd231ps_fma(ZEXT1632(auVar10),ZEXT1632(auVar168),ZEXT832(0) << 0x20);
              auVar137 = vrcpps_avx(ZEXT1632(auVar110));
              auVar215._8_4_ = 0x3f800000;
              auVar215._0_8_ = 0x3f8000003f800000;
              auVar215._12_4_ = 0x3f800000;
              auVar215._16_4_ = 0x3f800000;
              auVar215._20_4_ = 0x3f800000;
              auVar215._24_4_ = 0x3f800000;
              auVar215._28_4_ = 0x3f800000;
              auVar216 = ZEXT3264(auVar215);
              auVar10 = vfnmadd213ps_fma(auVar137,ZEXT1632(auVar110),auVar215);
              auVar10 = vfmadd132ps_fma(ZEXT1632(auVar10),auVar137,auVar137);
              auVar86._4_4_ = auVar185._4_4_ * auVar118._4_4_;
              auVar86._0_4_ = auVar185._0_4_ * auVar118._0_4_;
              auVar86._8_4_ = auVar185._8_4_ * auVar118._8_4_;
              auVar86._12_4_ = auVar185._12_4_ * auVar118._12_4_;
              auVar86._16_4_ = auVar118._16_4_ * 0.0;
              auVar86._20_4_ = auVar118._20_4_ * 0.0;
              auVar86._24_4_ = auVar118._24_4_ * 0.0;
              auVar86._28_4_ = auVar20._28_4_;
              auVar190 = vfmadd231ps_fma(auVar86,auVar187,ZEXT1632(auVar190));
              auVar190 = vfmadd231ps_fma(ZEXT1632(auVar190),ZEXT1632(auVar168),auVar120);
              fVar147 = auVar10._0_4_;
              fVar146 = auVar10._4_4_;
              fVar125 = auVar10._8_4_;
              fVar126 = auVar10._12_4_;
              auVar118 = ZEXT1632(CONCAT412(fVar126 * auVar190._12_4_,
                                            CONCAT48(fVar125 * auVar190._8_4_,
                                                     CONCAT44(fVar146 * auVar190._4_4_,
                                                              fVar147 * auVar190._0_4_))));
              uVar108 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar166._4_4_ = uVar108;
              auVar166._0_4_ = uVar108;
              auVar166._8_4_ = uVar108;
              auVar166._12_4_ = uVar108;
              auVar166._16_4_ = uVar108;
              auVar166._20_4_ = uVar108;
              auVar166._24_4_ = uVar108;
              auVar166._28_4_ = uVar108;
              auVar120 = vcmpps_avx(local_500,auVar118,2);
              auVar187 = vcmpps_avx(auVar118,auVar166,2);
              auVar120 = vandps_avx(auVar187,auVar120);
              auVar10 = vpackssdw_avx(auVar120._0_16_,auVar120._16_16_);
              auVar171 = vpand_avx(auVar171,auVar10);
              auVar120 = vpmovsxwd_avx2(auVar171);
              if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar120 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar120 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar120 >> 0x7f,0) == '\0') &&
                    (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar120 >> 0xbf,0) == '\0') &&
                  (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar120[0x1f]) goto LAB_017a1206;
              auVar120 = vcmpps_avx(ZEXT1632(auVar110),ZEXT832(0) << 0x20,4);
              auVar10 = vpackssdw_avx(auVar120._0_16_,auVar120._16_16_);
              auVar171 = vpand_avx(auVar171,auVar10);
              auVar120 = vpmovsxwd_avx2(auVar171);
              auVar167._8_8_ = local_680[1]._8_8_;
              auVar167._0_8_ = local_680[1]._0_8_;
              auVar167._16_8_ = local_680[1]._16_8_;
              auVar167._24_8_ = local_680[1]._24_8_;
              if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar120 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar120 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar120 >> 0x7f,0) != '\0') ||
                    (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar120 >> 0xbf,0) != '\0') ||
                  (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar120[0x1f] < '\0') {
                auVar137 = ZEXT1632(CONCAT412(fVar126 * auVar11._12_4_,
                                              CONCAT48(fVar125 * auVar11._8_4_,
                                                       CONCAT44(fVar146 * auVar11._4_4_,
                                                                fVar147 * auVar11._0_4_))));
                auVar87._28_4_ = SUB84(local_680[1]._24_8_,4);
                auVar87._0_28_ =
                     ZEXT1628(CONCAT412(fVar126 * auVar12._12_4_,
                                        CONCAT48(fVar125 * auVar12._8_4_,
                                                 CONCAT44(fVar146 * auVar12._4_4_,
                                                          fVar147 * auVar12._0_4_))));
                auVar205._8_4_ = 0x3f800000;
                auVar205._0_8_ = 0x3f8000003f800000;
                auVar205._12_4_ = 0x3f800000;
                auVar205._16_4_ = 0x3f800000;
                auVar205._20_4_ = 0x3f800000;
                auVar205._24_4_ = 0x3f800000;
                auVar205._28_4_ = 0x3f800000;
                auVar187 = vsubps_avx(auVar205,auVar137);
                local_120 = vblendvps_avx(auVar187,auVar137,auVar18);
                auVar187 = vsubps_avx(auVar205,auVar87);
                local_540 = vblendvps_avx(auVar187,auVar87,auVar18);
                auVar167 = auVar120;
                local_620 = auVar118;
              }
            }
            auVar212 = ZEXT3264(CONCAT428(fStack_764,
                                          CONCAT424(fStack_768,
                                                    CONCAT420(fStack_76c,
                                                              CONCAT416(fStack_770,
                                                                        CONCAT412(fStack_774,
                                                                                  CONCAT48(
                                                  fStack_778,CONCAT44(fStack_77c,local_780))))))));
            if ((((((((auVar167 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar167 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar167 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar167 >> 0x7f,0) != '\0') ||
                  (auVar167 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar167 >> 0xbf,0) != '\0') ||
                (auVar167 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar167[0x1f] < '\0') {
              auVar120 = vsubps_avx(ZEXT1632(auVar176),auVar121);
              auVar171 = vfmadd213ps_fma(auVar120,local_120,auVar121);
              fVar147 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar88._4_4_ = (auVar171._4_4_ + auVar171._4_4_) * fVar147;
              auVar88._0_4_ = (auVar171._0_4_ + auVar171._0_4_) * fVar147;
              auVar88._8_4_ = (auVar171._8_4_ + auVar171._8_4_) * fVar147;
              auVar88._12_4_ = (auVar171._12_4_ + auVar171._12_4_) * fVar147;
              auVar88._16_4_ = fVar147 * 0.0;
              auVar88._20_4_ = fVar147 * 0.0;
              auVar88._24_4_ = fVar147 * 0.0;
              auVar88._28_4_ = fVar147;
              auVar120 = vcmpps_avx(local_620,auVar88,6);
              auVar187 = auVar167 & auVar120;
              if ((((((((auVar187 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar187 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar187 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar187 >> 0x7f,0) != '\0') ||
                    (auVar187 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar187 >> 0xbf,0) != '\0') ||
                  (auVar187 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar187[0x1f] < '\0') {
                auVar140._8_4_ = 0xbf800000;
                auVar140._0_8_ = 0xbf800000bf800000;
                auVar140._12_4_ = 0xbf800000;
                auVar140._16_4_ = 0xbf800000;
                auVar140._20_4_ = 0xbf800000;
                auVar140._24_4_ = 0xbf800000;
                auVar140._28_4_ = 0xbf800000;
                auVar163._8_4_ = 0x40000000;
                auVar163._0_8_ = 0x4000000040000000;
                auVar163._12_4_ = 0x40000000;
                auVar163._16_4_ = 0x40000000;
                auVar163._20_4_ = 0x40000000;
                auVar163._24_4_ = 0x40000000;
                auVar163._28_4_ = 0x40000000;
                auVar171 = vfmadd213ps_fma(local_540,auVar163,auVar140);
                local_420 = local_120;
                local_400 = ZEXT1632(auVar171);
                local_3e0 = local_620;
                local_3a0 = local_8b0;
                uStack_398 = uStack_8a8;
                local_390 = local_8c0;
                uStack_388 = uStack_8b8;
                local_380 = local_8d0;
                uStack_378 = uStack_8c8;
                pGVar14 = (context->scene->geometries).items[(uint)local_880._4_4_].ptr;
                local_540 = local_400;
                if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  local_6a0 = vandps_avx(auVar120,auVar167);
                  fVar147 = (float)local_3c0;
                  local_340[0] = (fVar147 + local_120._0_4_ + 0.0) * local_160;
                  local_340[1] = (fVar147 + local_120._4_4_ + 1.0) * fStack_15c;
                  local_340[2] = (fVar147 + local_120._8_4_ + 2.0) * fStack_158;
                  local_340[3] = (fVar147 + local_120._12_4_ + 3.0) * fStack_154;
                  fStack_330 = (fVar147 + local_120._16_4_ + 4.0) * fStack_150;
                  fStack_32c = (fVar147 + local_120._20_4_ + 5.0) * fStack_14c;
                  fStack_328 = (fVar147 + local_120._24_4_ + 6.0) * fStack_148;
                  fStack_324 = fVar147 + local_120._28_4_ + 7.0;
                  local_540._0_8_ = auVar171._0_8_;
                  local_540._8_8_ = auVar171._8_8_;
                  local_320 = local_540._0_8_;
                  uStack_318 = local_540._8_8_;
                  uStack_310 = 0;
                  uStack_308 = 0;
                  local_300 = local_620;
                  auVar141._8_4_ = 0x7f800000;
                  auVar141._0_8_ = 0x7f8000007f800000;
                  auVar141._12_4_ = 0x7f800000;
                  auVar141._16_4_ = 0x7f800000;
                  auVar141._20_4_ = 0x7f800000;
                  auVar141._24_4_ = 0x7f800000;
                  auVar141._28_4_ = 0x7f800000;
                  auVar120 = vblendvps_avx(auVar141,local_620,local_6a0);
                  auVar187 = vshufps_avx(auVar120,auVar120,0xb1);
                  auVar187 = vminps_avx(auVar120,auVar187);
                  auVar118 = vshufpd_avx(auVar187,auVar187,5);
                  auVar187 = vminps_avx(auVar187,auVar118);
                  auVar118 = vpermpd_avx2(auVar187,0x4e);
                  auVar187 = vminps_avx(auVar187,auVar118);
                  auVar187 = vcmpps_avx(auVar120,auVar187,0);
                  auVar118 = local_6a0 & auVar187;
                  auVar120 = local_6a0;
                  if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar118 >> 0x7f,0) != '\0') ||
                        (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar118 >> 0xbf,0) != '\0') ||
                      (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar118[0x1f] < '\0') {
                    auVar120 = vandps_avx(auVar187,local_6a0);
                  }
                  uVar102 = vmovmskps_avx(auVar120);
                  uVar104 = 0;
                  for (; (uVar102 & 1) == 0; uVar102 = uVar102 >> 1 | 0x80000000) {
                    uVar104 = uVar104 + 1;
                  }
                  uVar103 = (ulong)uVar104;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar14->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar147 = local_340[uVar103];
                    uVar108 = *(undefined4 *)((long)&local_320 + uVar103 * 4);
                    fVar146 = 1.0 - fVar147;
                    auVar171 = ZEXT416((uint)(fVar147 * fVar146 * 4.0));
                    auVar176 = vfnmsub213ss_fma(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147),
                                                auVar171);
                    auVar171 = vfmadd213ss_fma(ZEXT416((uint)fVar146),ZEXT416((uint)fVar146),
                                               auVar171);
                    fVar146 = fVar146 * -fVar146 * 0.5;
                    fVar125 = auVar176._0_4_ * 0.5;
                    fVar126 = auVar171._0_4_ * 0.5;
                    fVar127 = fVar147 * fVar147 * 0.5;
                    auVar172._0_4_ = fVar127 * fVar124;
                    auVar172._4_4_ = fVar127 * fVar93;
                    auVar172._8_4_ = fVar127 * fVar94;
                    auVar172._12_4_ = fVar127 * fVar95;
                    auVar150._4_4_ = fVar126;
                    auVar150._0_4_ = fVar126;
                    auVar150._8_4_ = fVar126;
                    auVar150._12_4_ = fVar126;
                    auVar171 = vfmadd132ps_fma(auVar150,auVar172,auVar9);
                    auVar173._4_4_ = fVar125;
                    auVar173._0_4_ = fVar125;
                    auVar173._8_4_ = fVar125;
                    auVar173._12_4_ = fVar125;
                    auVar171 = vfmadd132ps_fma(auVar173,auVar171,auVar8);
                    auVar151._4_4_ = fVar146;
                    auVar151._0_4_ = fVar146;
                    auVar151._8_4_ = fVar146;
                    auVar151._12_4_ = fVar146;
                    auVar171 = vfmadd132ps_fma(auVar151,auVar171,auVar17);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_300 + uVar103 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar171._0_4_;
                    uVar202 = vextractps_avx(auVar171,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar202;
                    uVar202 = vextractps_avx(auVar171,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar202;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar147;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar108;
                    *(undefined4 *)(ray + k * 4 + 0x220) = uVar4;
                    *(undefined4 *)(ray + k * 4 + 0x240) = local_880._4_4_;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    uVar108 = *(undefined4 *)(ray + k * 4 + 0x100);
                    local_3bc = iVar101;
                    local_3b0 = uVar189;
                    uStack_3a8 = uVar98;
                    while( true ) {
                      fVar147 = local_340[uVar103];
                      auVar111._4_4_ = fVar147;
                      auVar111._0_4_ = fVar147;
                      auVar111._8_4_ = fVar147;
                      auVar111._12_4_ = fVar147;
                      local_220._16_4_ = fVar147;
                      local_220._0_16_ = auVar111;
                      local_220._20_4_ = fVar147;
                      local_220._24_4_ = fVar147;
                      local_220._28_4_ = fVar147;
                      local_200 = *(undefined4 *)((long)&local_320 + uVar103 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_300 + uVar103 * 4);
                      fVar125 = 1.0 - fVar147;
                      auVar171 = ZEXT416((uint)(fVar147 * fVar125 * 4.0));
                      auVar176 = vfnmsub213ss_fma(auVar111,auVar111,auVar171);
                      auVar171 = vfmadd213ss_fma(ZEXT416((uint)fVar125),ZEXT416((uint)fVar125),
                                                 auVar171);
                      fVar146 = auVar171._0_4_ * 0.5;
                      fVar147 = fVar147 * fVar147 * 0.5;
                      auVar174._0_4_ = fVar147 * fVar124;
                      auVar174._4_4_ = fVar147 * fVar93;
                      auVar174._8_4_ = fVar147 * fVar94;
                      auVar174._12_4_ = fVar147 * fVar95;
                      auVar152._4_4_ = fVar146;
                      auVar152._0_4_ = fVar146;
                      auVar152._8_4_ = fVar146;
                      auVar152._12_4_ = fVar146;
                      auVar171 = vfmadd132ps_fma(auVar152,auVar174,auVar9);
                      fVar147 = auVar176._0_4_ * 0.5;
                      auVar175._4_4_ = fVar147;
                      auVar175._0_4_ = fVar147;
                      auVar175._8_4_ = fVar147;
                      auVar175._12_4_ = fVar147;
                      auVar171 = vfmadd132ps_fma(auVar175,auVar171,auVar8);
                      local_810.context = context->user;
                      fVar147 = fVar125 * -fVar125 * 0.5;
                      auVar153._4_4_ = fVar147;
                      auVar153._0_4_ = fVar147;
                      auVar153._8_4_ = fVar147;
                      auVar153._12_4_ = fVar147;
                      auVar176 = vfmadd132ps_fma(auVar153,auVar171,auVar7);
                      local_280 = auVar176._0_4_;
                      uStack_27c = local_280;
                      uStack_278 = local_280;
                      uStack_274 = local_280;
                      uStack_270 = local_280;
                      uStack_26c = local_280;
                      uStack_268 = local_280;
                      uStack_264 = local_280;
                      auVar171 = vmovshdup_avx(auVar176);
                      local_260 = auVar171._0_8_;
                      uStack_258 = local_260;
                      uStack_250 = local_260;
                      uStack_248 = local_260;
                      auVar171 = vshufps_avx(auVar176,auVar176,0xaa);
                      auVar154._0_8_ = auVar171._0_8_;
                      auVar154._8_8_ = auVar154._0_8_;
                      auVar164._16_8_ = auVar154._0_8_;
                      auVar164._0_16_ = auVar154;
                      auVar164._24_8_ = auVar154._0_8_;
                      local_240 = auVar164;
                      uStack_1fc = local_200;
                      uStack_1f8 = local_200;
                      uStack_1f4 = local_200;
                      uStack_1f0 = local_200;
                      uStack_1ec = local_200;
                      uStack_1e8 = local_200;
                      uStack_1e4 = local_200;
                      local_1e0 = CONCAT44(uStack_13c,local_140);
                      uStack_1d8 = CONCAT44(uStack_134,uStack_138);
                      uStack_1d0 = CONCAT44(uStack_12c,uStack_130);
                      uStack_1c8 = CONCAT44(uStack_124,uStack_128);
                      local_1c0._4_4_ = uStack_63c;
                      local_1c0._0_4_ = local_640;
                      local_1c0._8_4_ = uStack_638;
                      local_1c0._12_4_ = uStack_634;
                      local_1c0._16_4_ = uStack_630;
                      local_1c0._20_4_ = uStack_62c;
                      local_1c0._24_4_ = uStack_628;
                      local_1c0._28_4_ = uStack_624;
                      auVar120 = vpcmpeqd_avx2(local_1c0,local_1c0);
                      local_7a8[1] = auVar120;
                      *local_7a8 = auVar120;
                      local_1a0 = (local_810.context)->instID[0];
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_180 = (local_810.context)->instPrimID[0];
                      uStack_17c = local_180;
                      uStack_178 = local_180;
                      uStack_174 = local_180;
                      uStack_170 = local_180;
                      uStack_16c = local_180;
                      uStack_168 = local_180;
                      uStack_164 = local_180;
                      local_680[0] = local_2e0;
                      local_810.valid = (int *)local_680;
                      local_810.geometryUserPtr = pGVar14->userPtr;
                      local_810.hit = (RTCHitN *)&local_280;
                      local_810.N = 8;
                      local_810.ray = (RTCRayN *)ray;
                      if (pGVar14->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar164 = ZEXT1632(auVar154);
                        auVar216 = ZEXT1664(auVar216._0_16_);
                        (*pGVar14->intersectionFilterN)(&local_810);
                      }
                      auVar187 = vpcmpeqd_avx2(local_680[0],_DAT_01faff00);
                      auVar118 = vpcmpeqd_avx2(auVar164,auVar164);
                      auVar120 = auVar118 & ~auVar187;
                      if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar120 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar120 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar120 >> 0x7f,0) == '\0') &&
                            (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar120 >> 0xbf,0) == '\0') &&
                          (auVar120 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar120[0x1f]) {
                        auVar187 = auVar187 ^ auVar118;
                      }
                      else {
                        p_Var15 = context->args->filter;
                        if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar118 = ZEXT1632(auVar118._0_16_);
                          auVar216 = ZEXT1664(auVar216._0_16_);
                          (*p_Var15)(&local_810);
                        }
                        auVar137 = vpcmpeqd_avx2(local_680[0],
                                                 SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                        auVar118 = vpcmpeqd_avx2(auVar118,auVar118);
                        auVar187 = auVar137 ^ auVar118;
                        auVar120 = auVar118 & ~auVar137;
                        if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar120 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar120 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar120 >> 0x7f,0) != '\0')
                              || (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar120 >> 0xbf,0) != '\0') ||
                            (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar120[0x1f] < '\0') {
                          auVar142._0_4_ = auVar137._0_4_ ^ auVar118._0_4_;
                          auVar142._4_4_ = auVar137._4_4_ ^ auVar118._4_4_;
                          auVar142._8_4_ = auVar137._8_4_ ^ auVar118._8_4_;
                          auVar142._12_4_ = auVar137._12_4_ ^ auVar118._12_4_;
                          auVar142._16_4_ = auVar137._16_4_ ^ auVar118._16_4_;
                          auVar142._20_4_ = auVar137._20_4_ ^ auVar118._20_4_;
                          auVar142._24_4_ = auVar137._24_4_ ^ auVar118._24_4_;
                          auVar142._28_4_ = auVar137._28_4_ ^ auVar118._28_4_;
                          auVar120 = vmaskmovps_avx(auVar142,*(undefined1 (*) [32])local_810.hit);
                          *(undefined1 (*) [32])(local_810.ray + 0x180) = auVar120;
                          auVar120 = vmaskmovps_avx(auVar142,*(undefined1 (*) [32])
                                                              (local_810.hit + 0x20));
                          *(undefined1 (*) [32])(local_810.ray + 0x1a0) = auVar120;
                          auVar120 = vmaskmovps_avx(auVar142,*(undefined1 (*) [32])
                                                              (local_810.hit + 0x40));
                          *(undefined1 (*) [32])(local_810.ray + 0x1c0) = auVar120;
                          auVar120 = vmaskmovps_avx(auVar142,*(undefined1 (*) [32])
                                                              (local_810.hit + 0x60));
                          *(undefined1 (*) [32])(local_810.ray + 0x1e0) = auVar120;
                          auVar120 = vmaskmovps_avx(auVar142,*(undefined1 (*) [32])
                                                              (local_810.hit + 0x80));
                          *(undefined1 (*) [32])(local_810.ray + 0x200) = auVar120;
                          auVar120 = vpmaskmovd_avx2(auVar142,*(undefined1 (*) [32])
                                                               (local_810.hit + 0xa0));
                          *(undefined1 (*) [32])(local_810.ray + 0x220) = auVar120;
                          auVar120 = vpmaskmovd_avx2(auVar142,*(undefined1 (*) [32])
                                                               (local_810.hit + 0xc0));
                          *(undefined1 (*) [32])(local_810.ray + 0x240) = auVar120;
                          auVar120 = vpmaskmovd_avx2(auVar142,*(undefined1 (*) [32])
                                                               (local_810.hit + 0xe0));
                          *(undefined1 (*) [32])(local_810.ray + 0x260) = auVar120;
                          auVar120 = vpmaskmovd_avx2(auVar142,*(undefined1 (*) [32])
                                                               (local_810.hit + 0x100));
                          *(undefined1 (*) [32])(local_810.ray + 0x280) = auVar120;
                        }
                      }
                      auVar120 = local_620;
                      if ((((((((auVar187 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar187 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar187 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar187 >> 0x7f,0) == '\0') &&
                            (auVar187 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar187 >> 0xbf,0) == '\0') &&
                          (auVar187 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar187[0x1f]) {
                        *(undefined4 *)(ray + k * 4 + 0x100) = uVar108;
                      }
                      else {
                        uVar108 = *(undefined4 *)(ray + k * 4 + 0x100);
                      }
                      *(undefined4 *)(local_6a0 + uVar103 * 4) = 0;
                      auVar122._4_4_ = uVar108;
                      auVar122._0_4_ = uVar108;
                      auVar122._8_4_ = uVar108;
                      auVar122._12_4_ = uVar108;
                      auVar122._16_4_ = uVar108;
                      auVar122._20_4_ = uVar108;
                      auVar122._24_4_ = uVar108;
                      auVar122._28_4_ = uVar108;
                      auVar118 = vcmpps_avx(auVar120,auVar122,2);
                      auVar187 = vandps_avx(auVar118,local_6a0);
                      local_6a0 = local_6a0 & auVar118;
                      if ((((((((local_6a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (local_6a0 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (local_6a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(local_6a0 >> 0x7f,0) == '\0') &&
                            (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(local_6a0 >> 0xbf,0) == '\0') &&
                          (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < local_6a0[0x1f]) break;
                      auVar143._8_4_ = 0x7f800000;
                      auVar143._0_8_ = 0x7f8000007f800000;
                      auVar143._12_4_ = 0x7f800000;
                      auVar143._16_4_ = 0x7f800000;
                      auVar143._20_4_ = 0x7f800000;
                      auVar143._24_4_ = 0x7f800000;
                      auVar143._28_4_ = 0x7f800000;
                      auVar120 = vblendvps_avx(auVar143,auVar120,auVar187);
                      auVar118 = vshufps_avx(auVar120,auVar120,0xb1);
                      auVar118 = vminps_avx(auVar120,auVar118);
                      auVar137 = vshufpd_avx(auVar118,auVar118,5);
                      auVar118 = vminps_avx(auVar118,auVar137);
                      auVar137 = vpermpd_avx2(auVar118,0x4e);
                      auVar118 = vminps_avx(auVar118,auVar137);
                      auVar118 = vcmpps_avx(auVar120,auVar118,0);
                      auVar137 = auVar187 & auVar118;
                      auVar120 = auVar187;
                      if ((((((((auVar137 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar137 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar137 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar137 >> 0x7f,0) != '\0') ||
                            (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar137 >> 0xbf,0) != '\0') ||
                          (auVar137 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar137[0x1f] < '\0') {
                        auVar120 = vandps_avx(auVar118,auVar187);
                      }
                      uVar102 = vmovmskps_avx(auVar120);
                      uVar104 = 0;
                      for (; (uVar102 & 1) == 0; uVar102 = uVar102 >> 1 | 0x80000000) {
                        uVar104 = uVar104 + 1;
                      }
                      uVar103 = (ulong)uVar104;
                      local_6a0 = auVar187;
                    }
                    auVar212 = ZEXT3264(CONCAT428(fStack_764,
                                                  CONCAT424(fStack_768,
                                                            CONCAT420(fStack_76c,
                                                                      CONCAT416(fStack_770,
                                                                                CONCAT412(fStack_774
                                                                                          ,CONCAT48(
                                                  fStack_778,CONCAT44(fStack_77c,local_780))))))));
                  }
                }
              }
            }
          }
          lVar106 = lVar106 + 8;
        } while ((int)lVar106 < iVar101);
      }
      uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar119._4_4_ = uVar4;
      auVar119._0_4_ = uVar4;
      auVar119._8_4_ = uVar4;
      auVar119._12_4_ = uVar4;
      auVar119._16_4_ = uVar4;
      auVar119._20_4_ = uVar4;
      auVar119._24_4_ = uVar4;
      auVar119._28_4_ = uVar4;
      auVar120 = vcmpps_avx(local_80,auVar119,2);
      uVar104 = vmovmskps_avx(auVar120);
      uVar104 = (uint)uVar107 & uVar104;
    } while (uVar104 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }